

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O1

void duckdb_brotli::BrotliSplitBlock
               (MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
               size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
               BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ushort uVar15;
  Command *pCVar16;
  ulong uVar17;
  uint8_t *puVar18;
  HistogramLiteral *tmp;
  HistogramLiteral *pHVar19;
  uint32_t *puVar20;
  void *pvVar21;
  uint16_t *puVar22;
  HistogramCommand *tmp_00;
  HistogramCommand *pHVar23;
  void *pvVar24;
  ulong uVar25;
  ushort *puVar26;
  void *pvVar27;
  void *pvVar28;
  void *pvVar29;
  void *pvVar30;
  HistogramDistance *pHVar31;
  ulong uVar32;
  uint32_t *puVar33;
  ulong uVar34;
  uint32_t *puVar35;
  uint32_t *puVar36;
  size_t sVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  uint32_t uVar42;
  long lVar43;
  byte *pbVar44;
  size_t block_idx;
  long lVar45;
  HistogramDistance *pHVar46;
  size_t __n;
  uint *puVar47;
  byte bVar48;
  uint uVar49;
  byte bVar50;
  uint uVar51;
  ulong uVar52;
  void *pvVar53;
  size_t __n_00;
  uint *puVar54;
  size_t block_idx_2;
  size_t sVar55;
  size_t block_idx_1;
  ulong uVar56;
  void *pvVar57;
  int iVar64;
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar65;
  undefined1 auVar63 [16];
  double dVar66;
  long lVar72;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  int iVar120;
  int iVar121;
  int iVar128;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  int iVar129;
  undefined1 auVar127 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  HistogramDistance *local_118;
  uint32_t *local_110;
  void *local_108;
  long local_100;
  HistogramCommand *local_f0;
  long local_e8;
  HistogramLiteral *local_e0;
  void *local_d8;
  uint32_t *local_d0;
  uint32_t *local_c0;
  long local_b8;
  uint32_t *local_a8;
  void *local_a0;
  long local_98;
  long local_88;
  HistogramPair *local_80;
  HistogramDistance *local_78;
  HistogramPair *local_60;
  HistogramCommand *local_58;
  
  uVar52 = 0;
  pCVar16 = cmds;
  sVar37 = num_commands;
  if (num_commands != 0) {
    do {
      uVar52 = uVar52 + pCVar16->insert_len_;
      sVar37 = sVar37 - 1;
      pCVar16 = pCVar16 + 1;
    } while (sVar37 != 0);
  }
  if (uVar52 == 0) {
    local_118 = (HistogramDistance *)0x0;
  }
  else {
    local_118 = (HistogramDistance *)BrotliAllocate(m,uVar52);
  }
  if (num_commands != 0) {
    puVar20 = &cmds->copy_len_;
    lVar43 = 0;
    sVar37 = num_commands;
    do {
      uVar56 = pos & mask;
      __n_00 = (size_t)((Command *)(puVar20 + -1))->insert_len_;
      if (mask < uVar56 + __n_00) {
        __n = (mask + 1) - uVar56;
        switchD_00b1422a::default((void *)((long)local_118 + lVar43),data + uVar56,__n);
        lVar43 = lVar43 + __n;
        __n_00 = __n_00 - __n;
        uVar56 = 0;
      }
      if (__n_00 != 0) {
        switchD_00b1422a::default((void *)((long)local_118 + lVar43),data + uVar56,__n_00);
        lVar43 = lVar43 + __n_00;
      }
      pos = (ulong)(*puVar20 & 0x1ffffff) + __n_00 + uVar56;
      puVar20 = puVar20 + 4;
      sVar37 = sVar37 - 1;
    } while (sVar37 != 0);
  }
  uVar56 = 100;
  if (uVar52 < 0xd480) {
    uVar56 = uVar52 / 0x220 + 1;
  }
  if (uVar52 == 0) {
    literal_split->num_types = 1;
  }
  else if (uVar52 < 0x80) {
    uVar56 = literal_split->types_alloc_size;
    uVar17 = literal_split->num_blocks + 1;
    if (uVar56 < uVar17) {
      if (uVar56 == 0) {
        uVar56 = uVar17;
      }
      do {
        uVar25 = uVar56;
        uVar56 = uVar25 * 2;
      } while (uVar25 < uVar17);
      if (uVar25 == 0) {
        puVar18 = (uint8_t *)0x0;
      }
      else {
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar25);
      }
      if (literal_split->types_alloc_size != 0) {
        switchD_00b1422a::default(puVar18,literal_split->types,literal_split->types_alloc_size);
      }
      BrotliFree(m,literal_split->types);
      literal_split->types = puVar18;
      literal_split->types_alloc_size = uVar25;
    }
    uVar56 = literal_split->lengths_alloc_size;
    uVar17 = literal_split->num_blocks + 1;
    if (uVar56 < uVar17) {
      if (uVar56 == 0) {
        uVar56 = uVar17;
      }
      do {
        uVar25 = uVar56;
        uVar56 = uVar25 * 2;
      } while (uVar25 < uVar17);
      if (uVar25 == 0) {
        puVar20 = (uint32_t *)0x0;
      }
      else {
        puVar20 = (uint32_t *)BrotliAllocate(m,uVar25 * 4);
      }
      if (literal_split->lengths_alloc_size != 0) {
        switchD_00b1422a::default
                  (puVar20,literal_split->lengths,literal_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,literal_split->lengths);
      literal_split->lengths = puVar20;
      literal_split->lengths_alloc_size = uVar25;
    }
    literal_split->num_types = 1;
    literal_split->types[literal_split->num_blocks] = '\0';
    sVar37 = literal_split->num_blocks;
    literal_split->lengths[sVar37] = (uint32_t)uVar52;
    literal_split->num_blocks = sVar37 + 1;
  }
  else {
    pvVar57 = BrotliAllocate(m,uVar56 * 0x410 + 0x410);
    uVar17 = uVar56;
    pvVar21 = pvVar57;
    do {
      switchD_005700f1::default(pvVar21,0,0x408);
      *(undefined8 *)((long)pvVar21 + 0x408) = 0x7ff0000000000000;
      pvVar21 = (void *)((long)pvVar21 + 0x410);
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
    uVar25 = 0;
    uVar17 = 7;
    do {
      uVar34 = (uVar25 * uVar52) / uVar56;
      if (uVar25 != 0) {
        uVar17 = (ulong)(uint)((int)uVar17 * 0x41a7);
        uVar34 = uVar34 + uVar17 % (uVar52 / uVar56);
      }
      if (uVar52 <= uVar34 + 0x46) {
        uVar34 = uVar52 - 0x47;
      }
      plVar2 = (long *)((long)pvVar57 + uVar25 * 0x410 + 0x400);
      *plVar2 = *plVar2 + 0x46;
      lVar43 = -0x46;
      do {
        piVar1 = (int *)((long)pvVar57 +
                        (ulong)*(byte *)((long)local_118 + lVar43 + uVar34 + 0x46) * 4 +
                        uVar25 * 0x410);
        *piVar1 = *piVar1 + 1;
        lVar43 = lVar43 + 1;
      } while (lVar43 != 0);
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar56);
    uVar17 = (uVar52 * 2) / 0x46 + uVar56 + 99;
    if (uVar17 != uVar17 % uVar56) {
      pvVar21 = (void *)(uVar56 * 0x410 + (long)pvVar57);
      uVar34 = 7;
      uVar25 = 0;
      do {
        switchD_005700f1::default(pvVar21,0,0x408);
        *(undefined8 *)((long)pvVar21 + 0x408) = 0x7ff0000000000000;
        uVar34 = (ulong)(uint)((int)uVar34 * 0x41a7);
        pbVar44 = (byte *)(uVar34 % (uVar52 - 0x45) + (long)local_118);
        *(undefined8 *)((long)pvVar21 + 0x400) = 0x46;
        lVar43 = -0x46;
        do {
          bVar48 = *pbVar44;
          pbVar44 = pbVar44 + 1;
          piVar1 = (int *)((long)pvVar21 + (ulong)bVar48 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = lVar43 + 1;
        } while (lVar43 != 0);
        lVar43 = (uVar25 % uVar56) * 0x410;
        plVar2 = (long *)((long)pvVar57 + lVar43 + 0x400);
        *plVar2 = *plVar2 + 0x46;
        lVar40 = 0;
        do {
          piVar1 = (int *)((long)pvVar57 + lVar40 * 4 + lVar43);
          *piVar1 = *piVar1 + *(int *)((long)pvVar21 + lVar40 * 4);
          lVar40 = lVar40 + 1;
        } while (lVar40 != 0x100);
        uVar25 = uVar25 + 1;
      } while (uVar25 < uVar17 - uVar17 % uVar56);
    }
    pvVar21 = BrotliAllocate(m,uVar52);
    pvVar24 = BrotliAllocate(m,uVar56 << 0xb);
    pvVar27 = BrotliAllocate(m,uVar56 * 8);
    sVar37 = (uVar56 + 7 >> 3) * uVar52;
    if (sVar37 == 0) {
      local_e0 = (HistogramLiteral *)0x0;
    }
    else {
      local_e0 = (HistogramLiteral *)BrotliAllocate(m,sVar37);
    }
    pvVar28 = BrotliAllocate(m,uVar56 * 2);
    lVar43 = 3;
    if (10 < params->quality) {
      lVar43 = 10;
    }
    uVar17 = uVar52 - 1;
    lVar40 = 0;
    do {
      uVar25 = uVar56 + 7 >> 3;
      if (uVar56 < 2) {
        switchD_005700f1::default(pvVar21,0,uVar52);
        uVar34 = 1;
        auVar139 = _DAT_01352200;
      }
      else {
        switchD_005700f1::default(pvVar24,0,uVar56 << 0xb);
        uVar34 = 0;
        puVar54 = (uint *)((long)pvVar57 + 0x400);
        do {
          uVar32 = (ulong)*puVar54;
          if (uVar32 < 0x100) {
            dVar58 = (double)(&kBrotliLog2Table)[uVar32];
          }
          else {
            dVar58 = log2((double)uVar32);
          }
          *(double *)((long)pvVar24 + uVar34 * 8) = dVar58;
          uVar34 = uVar34 + 1;
          puVar54 = puVar54 + 0x104;
        } while (uVar56 != uVar34);
        pvVar29 = (void *)(uVar56 * 0x7f8 + (long)pvVar24);
        lVar45 = 0x100;
        puVar54 = (uint *)((long)pvVar57 + 0x3fc);
        do {
          lVar45 = lVar45 + -1;
          uVar34 = 0;
          puVar47 = puVar54;
          do {
            dVar66 = -2.0;
            dVar58 = *(double *)((long)pvVar24 + uVar34 * 8);
            uVar32 = (ulong)*puVar47;
            if (uVar32 != 0) {
              if (*puVar47 < 0x100) {
                dVar66 = (double)(&kBrotliLog2Table)[uVar32];
              }
              else {
                dVar66 = log2((double)uVar32);
              }
            }
            *(double *)((long)pvVar29 + uVar34 * 8) = dVar58 - dVar66;
            uVar34 = uVar34 + 1;
            puVar47 = puVar47 + 0x104;
          } while (uVar56 != uVar34);
          pvVar29 = (void *)((long)pvVar29 + uVar56 * -8);
          puVar54 = puVar54 + -1;
        } while (lVar45 != 0);
        switchD_005700f1::default(pvVar27,0,uVar56 * 8);
        switchD_005700f1::default(local_e0,0,uVar25 * uVar52);
        auVar139 = _DAT_01352200;
        uVar34 = 0;
        do {
          bVar48 = *(byte *)((long)local_118 + uVar34);
          uVar32 = 0;
          dVar58 = 1e+99;
          do {
            dVar66 = *(double *)((long)pvVar24 + uVar32 * 8 + bVar48 * uVar56 * 8) +
                     *(double *)((long)pvVar27 + uVar32 * 8);
            *(double *)((long)pvVar27 + uVar32 * 8) = dVar66;
            if (dVar66 < dVar58) {
              *(char *)((long)pvVar21 + uVar34) = (char)uVar32;
              dVar58 = dVar66;
            }
            uVar32 = uVar32 + 1;
          } while (uVar56 != uVar32);
          dVar66 = 28.1;
          if (uVar34 < 2000) {
            dVar66 = (((double)(long)uVar34 * 0.07) / 2000.0 + 0.77) * 28.1;
          }
          uVar32 = 0;
          do {
            dVar73 = *(double *)((long)pvVar27 + uVar32 * 8) - dVar58;
            *(double *)((long)pvVar27 + uVar32 * 8) = dVar73;
            if (dVar66 <= dVar73) {
              *(double *)((long)pvVar27 + uVar32 * 8) = dVar66;
              pbVar44 = (byte *)((long)local_e0 + (uVar32 >> 3) + uVar34 * uVar25);
              *pbVar44 = *pbVar44 | '\x01' << ((byte)uVar32 & 7);
            }
            uVar32 = uVar32 + 1;
          } while (uVar56 != uVar32);
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar52);
        if (uVar17 == 0) {
          uVar34 = 1;
        }
        else {
          bVar48 = *(byte *)((long)pvVar21 + uVar17);
          pvVar29 = (void *)((uVar52 - 2) * uVar25 + (long)local_e0);
          uVar34 = 1;
          uVar32 = uVar52;
          do {
            if ((*(byte *)((long)pvVar29 + (ulong)(bVar48 >> 3)) >> (bVar48 & 7) & 1) != 0) {
              bVar50 = *(byte *)((long)pvVar21 + (uVar32 - 2));
              uVar34 = uVar34 + (bVar48 != bVar50);
              bVar48 = bVar50;
            }
            *(byte *)((long)pvVar21 + (uVar32 - 2)) = bVar48;
            pvVar29 = (void *)((long)pvVar29 - uVar25);
            uVar32 = uVar32 - 1;
          } while (uVar32 != 1);
        }
      }
      if (uVar56 != 0) {
        lVar45 = uVar56 - 1;
        auVar101._8_4_ = (int)lVar45;
        auVar101._0_8_ = lVar45;
        auVar101._12_4_ = (int)((ulong)lVar45 >> 0x20);
        auVar101 = auVar101 ^ auVar139;
        lVar45 = 0;
        auVar96 = _DAT_0135a310;
        auVar134 = _DAT_0135a330;
        auVar138 = _DAT_0135a360;
        auVar100 = _DAT_0135a350;
        do {
          auVar117 = auVar96 ^ auVar139;
          iVar121 = auVar101._0_4_;
          iVar120 = -(uint)(iVar121 < auVar117._0_4_);
          iVar64 = auVar101._4_4_;
          auVar80._4_4_ = -(uint)(iVar64 < auVar117._4_4_);
          iVar129 = auVar101._8_4_;
          iVar128 = -(uint)(iVar129 < auVar117._8_4_);
          iVar65 = auVar101._12_4_;
          auVar80._12_4_ = -(uint)(iVar65 < auVar117._12_4_);
          auVar108._4_4_ = iVar120;
          auVar108._0_4_ = iVar120;
          auVar108._8_4_ = iVar128;
          auVar108._12_4_ = iVar128;
          auVar130 = pshuflw(in_XMM8,auVar108,0xe8);
          auVar82._4_4_ = -(uint)(auVar117._4_4_ == iVar64);
          auVar82._12_4_ = -(uint)(auVar117._12_4_ == iVar65);
          auVar82._0_4_ = auVar82._4_4_;
          auVar82._8_4_ = auVar82._12_4_;
          auVar137 = pshuflw(in_XMM9,auVar82,0xe8);
          auVar80._0_4_ = auVar80._4_4_;
          auVar80._8_4_ = auVar80._12_4_;
          auVar131 = pshuflw(auVar130,auVar80,0xe8);
          auVar117._8_4_ = 0xffffffff;
          auVar117._0_8_ = 0xffffffffffffffff;
          auVar117._12_4_ = 0xffffffff;
          auVar117 = (auVar131 | auVar137 & auVar130) ^ auVar117;
          auVar117 = packssdw(auVar117,auVar117);
          if ((auVar117 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar28 + lVar45) = 0x100;
          }
          auVar80 = auVar82 & auVar108 | auVar80;
          auVar117 = packssdw(auVar80,auVar80);
          auVar131._8_4_ = 0xffffffff;
          auVar131._0_8_ = 0xffffffffffffffff;
          auVar131._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 ^ auVar131,auVar117 ^ auVar131);
          if ((auVar117._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)pvVar28 + lVar45 + 2) = 0x100;
          }
          auVar117 = auVar134 ^ auVar139;
          iVar120 = -(uint)(iVar121 < auVar117._0_4_);
          auVar122._4_4_ = -(uint)(iVar64 < auVar117._4_4_);
          iVar128 = -(uint)(iVar129 < auVar117._8_4_);
          auVar122._12_4_ = -(uint)(iVar65 < auVar117._12_4_);
          auVar81._4_4_ = iVar120;
          auVar81._0_4_ = iVar120;
          auVar81._8_4_ = iVar128;
          auVar81._12_4_ = iVar128;
          auVar107._4_4_ = -(uint)(auVar117._4_4_ == iVar64);
          auVar107._12_4_ = -(uint)(auVar117._12_4_ == iVar65);
          auVar107._0_4_ = auVar107._4_4_;
          auVar107._8_4_ = auVar107._12_4_;
          auVar122._0_4_ = auVar122._4_4_;
          auVar122._8_4_ = auVar122._12_4_;
          auVar117 = auVar107 & auVar81 | auVar122;
          auVar117 = packssdw(auVar117,auVar117);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 ^ auVar13,auVar117 ^ auVar13);
          if ((auVar117 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar28 + lVar45 + 4) = 0x100;
          }
          auVar82 = pshufhw(auVar81,auVar81,0x84);
          auVar108 = pshufhw(auVar107,auVar107,0x84);
          auVar80 = pshufhw(auVar82,auVar122,0x84);
          auVar83._8_4_ = 0xffffffff;
          auVar83._0_8_ = 0xffffffffffffffff;
          auVar83._12_4_ = 0xffffffff;
          auVar83 = (auVar80 | auVar108 & auVar82) ^ auVar83;
          auVar82 = packssdw(auVar83,auVar83);
          if ((auVar82 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar28 + lVar45 + 6) = 0x100;
          }
          auVar82 = auVar138 ^ auVar139;
          iVar120 = -(uint)(iVar121 < auVar82._0_4_);
          auVar85._4_4_ = -(uint)(iVar64 < auVar82._4_4_);
          iVar128 = -(uint)(iVar129 < auVar82._8_4_);
          auVar85._12_4_ = -(uint)(iVar65 < auVar82._12_4_);
          auVar109._4_4_ = iVar120;
          auVar109._0_4_ = iVar120;
          auVar109._8_4_ = iVar128;
          auVar109._12_4_ = iVar128;
          auVar117 = pshuflw(auVar117,auVar109,0xe8);
          auVar84._4_4_ = -(uint)(auVar82._4_4_ == iVar64);
          auVar84._12_4_ = -(uint)(auVar82._12_4_ == iVar65);
          auVar84._0_4_ = auVar84._4_4_;
          auVar84._8_4_ = auVar84._12_4_;
          in_XMM9 = pshuflw(auVar137 & auVar130,auVar84,0xe8);
          in_XMM9 = in_XMM9 & auVar117;
          auVar85._0_4_ = auVar85._4_4_;
          auVar85._8_4_ = auVar85._12_4_;
          auVar117 = pshuflw(auVar117,auVar85,0xe8);
          auVar130._8_4_ = 0xffffffff;
          auVar130._0_8_ = 0xffffffffffffffff;
          auVar130._12_4_ = 0xffffffff;
          auVar130 = (auVar117 | in_XMM9) ^ auVar130;
          auVar117 = packssdw(auVar130,auVar130);
          if ((auVar117 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar28 + lVar45 + 8) = 0x100;
          }
          auVar85 = auVar84 & auVar109 | auVar85;
          auVar117 = packssdw(auVar85,auVar85);
          auVar137._8_4_ = 0xffffffff;
          auVar137._0_8_ = 0xffffffffffffffff;
          auVar137._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 ^ auVar137,auVar117 ^ auVar137);
          if ((auVar117 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar28 + lVar45 + 10) = 0x100;
          }
          auVar117 = auVar100 ^ auVar139;
          iVar121 = -(uint)(iVar121 < auVar117._0_4_);
          auVar123._4_4_ = -(uint)(iVar64 < auVar117._4_4_);
          iVar129 = -(uint)(iVar129 < auVar117._8_4_);
          auVar123._12_4_ = -(uint)(iVar65 < auVar117._12_4_);
          auVar86._4_4_ = iVar121;
          auVar86._0_4_ = iVar121;
          auVar86._8_4_ = iVar129;
          auVar86._12_4_ = iVar129;
          auVar110._4_4_ = -(uint)(auVar117._4_4_ == iVar64);
          auVar110._12_4_ = -(uint)(auVar117._12_4_ == iVar65);
          auVar110._0_4_ = auVar110._4_4_;
          auVar110._8_4_ = auVar110._12_4_;
          auVar123._0_4_ = auVar123._4_4_;
          auVar123._8_4_ = auVar123._12_4_;
          auVar117 = auVar110 & auVar86 | auVar123;
          auVar117 = packssdw(auVar117,auVar117);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar117 ^ auVar14,auVar117 ^ auVar14);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar28 + lVar45 + 0xc) = 0x100;
          }
          auVar117 = pshufhw(auVar86,auVar86,0x84);
          auVar80 = pshufhw(auVar110,auVar110,0x84);
          auVar82 = pshufhw(auVar117,auVar123,0x84);
          auVar87._8_4_ = 0xffffffff;
          auVar87._0_8_ = 0xffffffffffffffff;
          auVar87._12_4_ = 0xffffffff;
          auVar87 = (auVar82 | auVar80 & auVar117) ^ auVar87;
          auVar117 = packssdw(auVar87,auVar87);
          if ((auVar117 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar28 + lVar45 + 0xe) = 0x100;
          }
          lVar72 = auVar96._8_8_;
          auVar96._0_8_ = auVar96._0_8_ + 8;
          auVar96._8_8_ = lVar72 + 8;
          lVar72 = auVar134._8_8_;
          auVar134._0_8_ = auVar134._0_8_ + 8;
          auVar134._8_8_ = lVar72 + 8;
          lVar72 = auVar138._8_8_;
          auVar138._0_8_ = auVar138._0_8_ + 8;
          auVar138._8_8_ = lVar72 + 8;
          lVar72 = auVar100._8_8_;
          auVar100._0_8_ = auVar100._0_8_ + 8;
          auVar100._8_8_ = lVar72 + 8;
          lVar45 = lVar45 + 0x10;
        } while (uVar25 * 0x10 != lVar45);
      }
      uVar56 = 0;
      uVar15 = 0;
      do {
        if (*(short *)((long)pvVar28 + (ulong)*(byte *)((long)pvVar21 + uVar56) * 2) == 0x100) {
          *(ushort *)((long)pvVar28 + (ulong)*(byte *)((long)pvVar21 + uVar56) * 2) = uVar15;
          uVar15 = uVar15 + 1;
        }
        uVar56 = uVar56 + 1;
      } while (uVar52 != uVar56);
      uVar56 = 0;
      do {
        *(undefined1 *)((long)pvVar21 + uVar56) =
             *(undefined1 *)((long)pvVar28 + (ulong)*(byte *)((long)pvVar21 + uVar56) * 2);
        uVar56 = uVar56 + 1;
      } while (uVar52 != uVar56);
      uVar56 = (ulong)uVar15;
      if (uVar15 != 0) {
        lVar45 = 0;
        do {
          switchD_005700f1::default((void *)((long)pvVar57 + lVar45),0,0x408);
          *(undefined8 *)((long)pvVar57 + lVar45 + 0x408) = 0x7ff0000000000000;
          lVar45 = lVar45 + 0x410;
        } while (uVar56 * 0x410 - lVar45 != 0);
      }
      uVar25 = 0;
      do {
        lVar45 = (ulong)*(byte *)((long)pvVar21 + uVar25) * 0x410;
        piVar1 = (int *)((long)pvVar57 + (ulong)*(byte *)((long)local_118 + uVar25) * 4 + lVar45);
        *piVar1 = *piVar1 + 1;
        plVar2 = (long *)((long)pvVar57 + lVar45 + 0x400);
        *plVar2 = *plVar2 + 1;
        uVar25 = uVar25 + 1;
      } while (uVar52 != uVar25);
      lVar40 = lVar40 + 1;
    } while (lVar40 != lVar43);
    BrotliFree(m,pvVar24);
    BrotliFree(m,pvVar27);
    BrotliFree(m,local_e0);
    BrotliFree(m,pvVar28);
    BrotliFree(m,pvVar57);
    if (uVar34 == 0) {
      local_110 = (uint32_t *)0x0;
    }
    else {
      local_110 = (uint32_t *)BrotliAllocate(m,uVar34 * 4);
    }
    lVar43 = uVar34 + 0x100;
    if (lVar43 == 0) {
      local_c0 = (uint32_t *)0x0;
    }
    else {
      local_c0 = (uint32_t *)BrotliAllocate(m,lVar43 * 4);
    }
    uVar25 = uVar34 * 0x10 + 0x3f0;
    uVar56 = uVar25 >> 6;
    if (uVar25 < 0x40) {
      local_e0 = (HistogramLiteral *)0x0;
      puVar20 = (uint32_t *)0x0;
    }
    else {
      local_e0 = (HistogramLiteral *)BrotliAllocate(m,uVar56 * 0x410);
      puVar20 = (uint32_t *)BrotliAllocate(m,uVar56 * 4);
    }
    if (uVar34 == 0) {
      local_f0 = (HistogramCommand *)0x0;
    }
    else {
      uVar25 = 0x40;
      if (uVar34 < 0x40) {
        uVar25 = uVar34;
      }
      local_f0 = (HistogramCommand *)BrotliAllocate(m,uVar25 * 0x410);
    }
    local_80 = (HistogramPair *)BrotliAllocate(m,0xc018);
    tmp = (HistogramLiteral *)BrotliAllocate(m,0x820);
    lVar40 = 0;
    switchD_005700f1::default(local_c0,0,lVar43 * 4);
    uVar25 = 0;
    do {
      local_c0[lVar40 + 0x100] = local_c0[lVar40 + 0x100] + 1;
      if ((uVar17 == uVar25) ||
         (*(char *)((long)pvVar21 + uVar25) != *(char *)((long)pvVar21 + uVar25 + 1))) {
        lVar40 = lVar40 + 1;
      }
      uVar25 = uVar25 + 1;
    } while (uVar52 != uVar25);
    if (uVar34 == 0) {
      uVar52 = 0;
    }
    else {
      local_98 = 0;
      local_88 = 0;
      uVar52 = 0;
      lVar43 = 0;
      uVar25 = 0;
      uVar17 = uVar34;
      puVar36 = local_110;
      local_78 = (HistogramDistance *)uVar56;
      do {
        uVar32 = 0x40;
        if (uVar17 < 0x40) {
          uVar32 = uVar17;
        }
        lVar40 = uVar32 + (uVar32 == 0);
        lVar45 = 0;
        do {
          uVar32 = (ulong)local_c0[uVar25 + lVar45 + 0x100];
          pHVar19 = (HistogramLiteral *)((long)local_f0 + lVar45 * 0x410);
          switchD_005700f1::default(pHVar19,0,0x408);
          ((HistogramLiteral *)((long)local_f0 + lVar45 * 0x410))->bit_cost_ = INFINITY;
          if (uVar32 != 0) {
            sVar37 = pHVar19->total_count_;
            do {
              sVar37 = sVar37 + 1;
              pHVar19->data_[*(byte *)((long)local_118 + lVar43)] =
                   pHVar19->data_[*(byte *)((long)local_118 + lVar43)] + 1;
              lVar43 = lVar43 + 1;
              pHVar19->total_count_ = sVar37;
              uVar32 = uVar32 - 1;
            } while (uVar32 != 0);
          }
          dVar58 = BrotliPopulationCostLiteral(pHVar19);
          pHVar19->bit_cost_ = dVar58;
          local_c0[lVar45 + 0x40] = (uint32_t)lVar45;
          local_c0[lVar45 + 0x80] = (uint32_t)lVar45;
          local_c0[lVar45] = 1;
          lVar45 = lVar45 + 1;
        } while (lVar45 != lVar40);
        sVar37 = uVar34 - uVar25;
        if (0x3f < sVar37) {
          sVar37 = 0x40;
        }
        sVar37 = BrotliHistogramCombineLiteral
                           ((HistogramLiteral *)local_f0,tmp,local_c0,local_c0 + 0x80,
                            local_c0 + 0x40,local_80,sVar37,sVar37,0x40,0x800);
        uVar32 = local_98 + sVar37;
        if (local_78 < uVar32) {
          pHVar31 = local_78;
          if (local_78 == (HistogramDistance *)0x0) {
            pHVar31 = (HistogramDistance *)uVar32;
          }
          do {
            uVar41 = (ulong)pHVar31;
            pHVar31 = (HistogramDistance *)(uVar41 * 2);
          } while (uVar41 < uVar32);
          if (uVar41 == 0) {
            pHVar19 = (HistogramLiteral *)0x0;
          }
          else {
            pHVar19 = (HistogramLiteral *)BrotliAllocate(m,uVar41 * 0x410);
          }
          if (local_78 != (HistogramDistance *)0x0) {
            switchD_00b1422a::default(pHVar19,local_e0,(long)local_78 * 0x410);
          }
          BrotliFree(m,local_e0);
          local_78 = (HistogramDistance *)uVar41;
          local_e0 = pHVar19;
        }
        uVar32 = local_88 + sVar37;
        if (uVar56 < uVar32) {
          uVar41 = uVar56;
          if (uVar56 == 0) {
            uVar41 = uVar32;
          }
          do {
            uVar38 = uVar41;
            uVar41 = uVar38 * 2;
          } while (uVar38 < uVar32);
          if (uVar38 == 0) {
            puVar35 = (uint32_t *)0x0;
          }
          else {
            puVar35 = (uint32_t *)BrotliAllocate(m,uVar38 * 4);
          }
          if (uVar56 != 0) {
            switchD_00b1422a::default(puVar35,puVar20,uVar56 << 2);
          }
          BrotliFree(m,puVar20);
          uVar56 = uVar38;
          puVar20 = puVar35;
        }
        if (sVar37 != 0) {
          pHVar19 = local_e0 + local_98;
          sVar55 = 0;
          do {
            switchD_00b1422a::default
                      (pHVar19,(HistogramLiteral *)
                               ((long)local_f0 + (ulong)local_c0[sVar55 + 0x40] * 0x410),0x410);
            puVar20[local_88 + sVar55] = local_c0[local_c0[sVar55 + 0x40]];
            local_c0[(ulong)local_c0[sVar55 + 0x40] + 0xc0] = (uint32_t)sVar55;
            sVar55 = sVar55 + 1;
            pHVar19 = pHVar19 + 1;
          } while (sVar37 != sVar55);
          local_98 = local_98 + sVar55;
          local_88 = local_88 + sVar55;
        }
        lVar45 = 0;
        do {
          puVar36[lVar45] = local_c0[(ulong)local_c0[lVar45 + 0x80] + 0xc0] + (int)uVar52;
          lVar45 = lVar45 + 1;
        } while (lVar40 != lVar45);
        uVar52 = uVar52 + sVar37;
        uVar25 = uVar25 + 0x40;
        uVar17 = uVar17 - 0x40;
        puVar36 = puVar36 + 0x40;
      } while (uVar25 < uVar34);
    }
    BrotliFree(m,local_f0);
    uVar56 = (uVar52 >> 1) * uVar52;
    if (uVar52 << 6 < uVar56) {
      uVar56 = uVar52 << 6;
    }
    if (0x800 < uVar56) {
      BrotliFree(m,local_80);
      local_80 = (HistogramPair *)BrotliAllocate(m,uVar56 * 0x18 + 0x18);
    }
    if (uVar52 == 0) {
      puVar36 = (uint32_t *)0x0;
    }
    else {
      puVar36 = (uint32_t *)BrotliAllocate(m,uVar52 * 4);
      auVar96 = _DAT_0135a320;
      auVar139 = _DAT_01352200;
      lVar43 = uVar52 - 1;
      auVar59._8_4_ = (int)lVar43;
      auVar59._0_8_ = lVar43;
      auVar59._12_4_ = (int)((ulong)lVar43 >> 0x20);
      uVar17 = 0;
      auVar59 = auVar59 ^ _DAT_01352200;
      auVar67 = _DAT_0135a310;
      do {
        bVar4 = auVar59._0_4_ < SUB164(auVar67 ^ auVar139,0);
        iVar121 = auVar59._4_4_;
        iVar64 = SUB164(auVar67 ^ auVar139,4);
        if ((bool)(~(iVar121 < iVar64 || iVar64 == iVar121 && bVar4) & 1)) {
          puVar36[uVar17] = (uint32_t)uVar17;
        }
        if (iVar121 >= iVar64 && (iVar64 != iVar121 || !bVar4)) {
          puVar36[uVar17 + 1] = (uint32_t)uVar17 + 1;
        }
        uVar17 = uVar17 + 2;
        lVar43 = auVar67._8_8_;
        auVar67._0_8_ = auVar67._0_8_ + auVar96._0_8_;
        auVar67._8_8_ = lVar43 + auVar96._8_8_;
      } while ((uVar52 + 1 & 0xfffffffffffffffe) != uVar17);
    }
    sVar37 = BrotliHistogramCombineLiteral
                       (local_e0,tmp,puVar20,local_110,puVar36,local_80,uVar52,uVar34,0x100,uVar56);
    BrotliFree(m,local_80);
    BrotliFree(m,puVar20);
    if (uVar52 == 0) {
      local_108 = (void *)0x0;
    }
    else {
      local_108 = BrotliAllocate(m,uVar52 * 4);
      switchD_005700f1::default(local_108,0xff,uVar52 << 2);
    }
    if (uVar34 != 0) {
      iVar121 = 0;
      local_e8 = 0;
      uVar52 = 0;
      do {
        switchD_005700f1::default(tmp,0,0x408);
        tmp->bit_cost_ = INFINITY;
        if (local_c0[uVar52 + 0x100] != 0) {
          sVar55 = tmp->total_count_;
          uVar56 = 0;
          do {
            tmp->data_[*(byte *)((long)local_118 + uVar56 + local_e8)] =
                 tmp->data_[*(byte *)((long)local_118 + uVar56 + local_e8)] + 1;
            tmp->total_count_ = sVar55 + 1 + uVar56;
            uVar56 = uVar56 + 1;
          } while (uVar56 < local_c0[uVar52 + 0x100]);
          local_e8 = local_e8 + uVar56;
        }
        lVar43 = 0;
        if (uVar52 != 0) {
          lVar43 = uVar52 - 1;
        }
        uVar51 = local_110[lVar43];
        uVar56 = (ulong)uVar51;
        local_f0 = (HistogramCommand *)
                   BrotliHistogramBitCostDistanceLiteral(tmp,local_e0 + uVar56,tmp + 1);
        if (sVar37 != 0) {
          sVar55 = 0;
          do {
            dVar58 = BrotliHistogramBitCostDistanceLiteral(tmp,local_e0 + puVar36[sVar55],tmp + 1);
            if (dVar58 < (double)local_f0) {
              uVar56 = (ulong)puVar36[sVar55];
              local_f0 = (HistogramCommand *)dVar58;
            }
            uVar51 = (uint)uVar56;
            sVar55 = sVar55 + 1;
          } while (sVar37 != sVar55);
        }
        local_110[uVar52] = uVar51;
        if (*(int *)((long)local_108 + (ulong)uVar51 * 4) == -1) {
          *(int *)((long)local_108 + (ulong)uVar51 * 4) = iVar121;
          iVar121 = iVar121 + 1;
        }
        uVar52 = uVar52 + 1;
      } while (uVar52 != uVar34);
    }
    BrotliFree(m,tmp);
    BrotliFree(m,puVar36);
    BrotliFree(m,local_e0);
    uVar52 = literal_split->types_alloc_size;
    if (uVar52 < uVar34) {
      if (uVar52 == 0) {
        uVar52 = uVar34;
      }
      do {
        uVar56 = uVar52;
        uVar52 = uVar56 * 2;
      } while (uVar56 < uVar34);
      if (uVar56 == 0) {
        puVar18 = (uint8_t *)0x0;
      }
      else {
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar56);
      }
      if (literal_split->types_alloc_size != 0) {
        switchD_00b1422a::default(puVar18,literal_split->types,literal_split->types_alloc_size);
      }
      BrotliFree(m,literal_split->types);
      literal_split->types = puVar18;
      literal_split->types_alloc_size = uVar56;
    }
    uVar52 = literal_split->lengths_alloc_size;
    if (uVar52 < uVar34) {
      if (uVar52 == 0) {
        uVar52 = uVar34;
      }
      do {
        uVar56 = uVar52;
        uVar52 = uVar56 * 2;
      } while (uVar56 < uVar34);
      if (uVar56 == 0) {
        puVar20 = (uint32_t *)0x0;
      }
      else {
        puVar20 = (uint32_t *)BrotliAllocate(m,uVar56 * 4);
      }
      if (literal_split->lengths_alloc_size != 0) {
        switchD_00b1422a::default
                  (puVar20,literal_split->lengths,literal_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,literal_split->lengths);
      literal_split->lengths = puVar20;
      literal_split->lengths_alloc_size = uVar56;
    }
    uVar42 = 0;
    if (uVar34 == 0) {
      sVar55 = 1;
      sVar37 = 0;
    }
    else {
      uVar51 = 0;
      sVar37 = 0;
      uVar52 = 0;
      do {
        uVar42 = uVar42 + local_c0[uVar52 + 0x100];
        if ((uVar34 - 1 == uVar52) || (local_110[uVar52] != local_110[uVar52 + 1])) {
          uVar49 = uVar51 & 0xff;
          uVar3 = *(uint *)((long)local_108 + (ulong)local_110[uVar52] * 4);
          bVar50 = (byte)uVar3;
          literal_split->types[sVar37] = bVar50;
          bVar48 = (byte)uVar51;
          uVar51 = uVar3;
          if (bVar50 < bVar48) {
            uVar51 = uVar49;
          }
          literal_split->lengths[sVar37] = uVar42;
          sVar37 = sVar37 + 1;
          uVar42 = 0;
        }
        uVar52 = uVar52 + 1;
      } while (uVar34 != uVar52);
      sVar55 = (ulong)(uVar51 & 0xff) + 1;
    }
    literal_split->num_blocks = sVar37;
    literal_split->num_types = sVar55;
    BrotliFree(m,local_108);
    BrotliFree(m,local_c0);
    BrotliFree(m,local_110);
    BrotliFree(m,pvVar21);
  }
  BrotliFree(m,local_118);
  if (num_commands == 0) {
    pvVar21 = (void *)0x0;
  }
  else {
    pvVar21 = BrotliAllocate(m,num_commands * 2);
    puVar22 = &cmds->cmd_prefix_;
    sVar37 = 0;
    do {
      *(uint16_t *)((long)pvVar21 + sVar37 * 2) = *puVar22;
      sVar37 = sVar37 + 1;
      puVar22 = puVar22 + 8;
    } while (num_commands != sVar37);
  }
  uVar52 = 0x32;
  if (num_commands < 0x6784) {
    uVar52 = num_commands / 0x212 + 1;
  }
  if (num_commands == 0) {
    insert_and_copy_split->num_types = 1;
  }
  else if (num_commands < 0x80) {
    uVar52 = insert_and_copy_split->types_alloc_size;
    uVar56 = insert_and_copy_split->num_blocks + 1;
    if (uVar52 < uVar56) {
      if (uVar52 == 0) {
        uVar52 = uVar56;
      }
      do {
        uVar17 = uVar52;
        uVar52 = uVar17 * 2;
      } while (uVar17 < uVar56);
      if (uVar17 == 0) {
        puVar18 = (uint8_t *)0x0;
      }
      else {
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar17);
      }
      if (insert_and_copy_split->types_alloc_size != 0) {
        switchD_00b1422a::default
                  (puVar18,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
      }
      BrotliFree(m,insert_and_copy_split->types);
      insert_and_copy_split->types = puVar18;
      insert_and_copy_split->types_alloc_size = uVar17;
    }
    uVar52 = insert_and_copy_split->lengths_alloc_size;
    uVar56 = insert_and_copy_split->num_blocks + 1;
    if (uVar52 < uVar56) {
      if (uVar52 == 0) {
        uVar52 = uVar56;
      }
      do {
        uVar17 = uVar52;
        uVar52 = uVar17 * 2;
      } while (uVar17 < uVar56);
      if (uVar17 == 0) {
        puVar20 = (uint32_t *)0x0;
      }
      else {
        puVar20 = (uint32_t *)BrotliAllocate(m,uVar17 * 4);
      }
      if (insert_and_copy_split->lengths_alloc_size != 0) {
        switchD_00b1422a::default
                  (puVar20,insert_and_copy_split->lengths,
                   insert_and_copy_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,insert_and_copy_split->lengths);
      insert_and_copy_split->lengths = puVar20;
      insert_and_copy_split->lengths_alloc_size = uVar17;
    }
    insert_and_copy_split->num_types = 1;
    insert_and_copy_split->types[insert_and_copy_split->num_blocks] = '\0';
    sVar37 = insert_and_copy_split->num_blocks;
    insert_and_copy_split->lengths[sVar37] = (uint32_t)num_commands;
    insert_and_copy_split->num_blocks = sVar37 + 1;
  }
  else {
    pvVar24 = BrotliAllocate(m,uVar52 * 0xb10 + 0xb10);
    uVar56 = uVar52;
    pvVar57 = pvVar24;
    do {
      switchD_005700f1::default(pvVar57,0,0xb08);
      *(undefined8 *)((long)pvVar57 + 0xb08) = 0x7ff0000000000000;
      pvVar57 = (void *)((long)pvVar57 + 0xb10);
      uVar56 = uVar56 - 1;
    } while (uVar56 != 0);
    uVar17 = 0;
    uVar56 = 7;
    do {
      uVar25 = (uVar17 * num_commands) / uVar52;
      if (uVar17 != 0) {
        uVar56 = (ulong)(uint)((int)uVar56 * 0x41a7);
        uVar25 = uVar25 + uVar56 % (num_commands / uVar52);
      }
      if (num_commands <= uVar25 + 0x28) {
        uVar25 = num_commands - 0x29;
      }
      plVar2 = (long *)((long)pvVar24 + uVar17 * 0xb10 + 0xb00);
      *plVar2 = *plVar2 + 0x28;
      lVar43 = 0;
      do {
        piVar1 = (int *)((long)pvVar24 +
                        (ulong)*(ushort *)((long)pvVar21 + lVar43 * 2 + uVar25 * 2) * 4 +
                        uVar17 * 0xb10);
        *piVar1 = *piVar1 + 1;
        lVar43 = lVar43 + 1;
      } while (lVar43 != 0x28);
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar52);
    uVar56 = (num_commands * 2) / 0x28 + uVar52 + 99;
    if (uVar56 != uVar56 % uVar52) {
      pvVar57 = (void *)(uVar52 * 0xb10 + (long)pvVar24);
      uVar25 = 7;
      uVar17 = 0;
      do {
        switchD_005700f1::default(pvVar57,0,0xb00);
        uVar25 = (ulong)(uint)((int)uVar25 * 0x41a7);
        puVar26 = (ushort *)((long)pvVar21 + (uVar25 % (num_commands - 0x27)) * 2);
        *(undefined8 *)((long)pvVar57 + 0xb00) = 0x28;
        lVar43 = -0x28;
        do {
          uVar15 = *puVar26;
          puVar26 = puVar26 + 1;
          piVar1 = (int *)((long)pvVar57 + (ulong)uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = lVar43 + 1;
        } while (lVar43 != 0);
        lVar43 = (uVar17 % uVar52) * 0xb10;
        plVar2 = (long *)((long)pvVar24 + lVar43 + 0xb00);
        *plVar2 = *plVar2 + 0x28;
        lVar40 = 0;
        do {
          piVar1 = (int *)((long)pvVar24 + lVar40 * 4 + lVar43);
          *piVar1 = *piVar1 + *(int *)((long)pvVar57 + lVar40 * 4);
          lVar40 = lVar40 + 1;
        } while (lVar40 != 0x2c0);
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar56 - uVar56 % uVar52);
      *(undefined8 *)((long)pvVar57 + 0xb08) = 0x7ff0000000000000;
    }
    pvVar57 = BrotliAllocate(m,num_commands);
    pvVar27 = BrotliAllocate(m,uVar52 * 0x1600);
    pvVar28 = BrotliAllocate(m,uVar52 * 8);
    sVar37 = (uVar52 + 7 >> 3) * num_commands;
    if (sVar37 == 0) {
      local_d8 = (void *)0x0;
    }
    else {
      local_d8 = BrotliAllocate(m,sVar37);
    }
    pvVar29 = BrotliAllocate(m,uVar52 * 2);
    lVar43 = 3;
    if (10 < params->quality) {
      lVar43 = 10;
    }
    sVar37 = num_commands - 1;
    lVar40 = 0;
    do {
      uVar56 = uVar52 + 7 >> 3;
      if (uVar52 < 2) {
        switchD_005700f1::default(pvVar57,0,num_commands);
        uVar17 = 1;
        auVar139 = _DAT_01352200;
      }
      else {
        switchD_005700f1::default(pvVar27,0,uVar52 * 0x1600);
        uVar17 = 0;
        puVar54 = (uint *)((long)pvVar24 + 0xb00);
        do {
          uVar25 = (ulong)*puVar54;
          if (uVar25 < 0x100) {
            dVar58 = (double)(&kBrotliLog2Table)[uVar25];
          }
          else {
            dVar58 = log2((double)uVar25);
          }
          *(double *)((long)pvVar27 + uVar17 * 8) = dVar58;
          uVar17 = uVar17 + 1;
          puVar54 = puVar54 + 0x2c4;
        } while (uVar52 != uVar17);
        pvVar53 = (void *)(uVar52 * 0x15f8 + (long)pvVar27);
        lVar45 = 0x2c0;
        puVar54 = (uint *)((long)pvVar24 + 0xafc);
        do {
          lVar45 = lVar45 + -1;
          uVar17 = 0;
          puVar47 = puVar54;
          do {
            dVar66 = -2.0;
            dVar58 = *(double *)((long)pvVar27 + uVar17 * 8);
            uVar25 = (ulong)*puVar47;
            if (uVar25 != 0) {
              if (*puVar47 < 0x100) {
                dVar66 = (double)(&kBrotliLog2Table)[uVar25];
              }
              else {
                dVar66 = log2((double)uVar25);
              }
            }
            *(double *)((long)pvVar53 + uVar17 * 8) = dVar58 - dVar66;
            uVar17 = uVar17 + 1;
            puVar47 = puVar47 + 0x2c4;
          } while (uVar52 != uVar17);
          pvVar53 = (void *)((long)pvVar53 + uVar52 * -8);
          puVar54 = puVar54 + -1;
        } while (lVar45 != 0);
        switchD_005700f1::default(pvVar28,0,uVar52 * 8);
        switchD_005700f1::default(local_d8,0,uVar56 * num_commands);
        auVar139 = _DAT_01352200;
        uVar17 = 0;
        do {
          uVar15 = *(ushort *)((long)pvVar21 + uVar17 * 2);
          uVar25 = 0;
          dVar58 = 1e+99;
          do {
            dVar66 = *(double *)((long)pvVar27 + uVar25 * 8 + uVar15 * uVar52 * 8) +
                     *(double *)((long)pvVar28 + uVar25 * 8);
            *(double *)((long)pvVar28 + uVar25 * 8) = dVar66;
            if (dVar66 < dVar58) {
              *(char *)((long)pvVar57 + uVar17) = (char)uVar25;
              dVar58 = dVar66;
            }
            uVar25 = uVar25 + 1;
          } while (uVar52 != uVar25);
          dVar66 = 13.5;
          if (uVar17 < 2000) {
            dVar66 = (((double)(long)uVar17 * 0.07) / 2000.0 + 0.77) * 13.5;
          }
          uVar25 = 0;
          do {
            dVar73 = *(double *)((long)pvVar28 + uVar25 * 8) - dVar58;
            *(double *)((long)pvVar28 + uVar25 * 8) = dVar73;
            if (dVar66 <= dVar73) {
              *(double *)((long)pvVar28 + uVar25 * 8) = dVar66;
              pbVar44 = (byte *)((long)local_d8 + (uVar25 >> 3) + uVar17 * uVar56);
              *pbVar44 = *pbVar44 | '\x01' << ((byte)uVar25 & 7);
            }
            uVar25 = uVar25 + 1;
          } while (uVar52 != uVar25);
          uVar17 = uVar17 + 1;
        } while (uVar17 != num_commands);
        if (sVar37 == 0) {
          uVar17 = 1;
        }
        else {
          bVar48 = *(byte *)((long)pvVar57 + sVar37);
          pvVar53 = (void *)((num_commands - 2) * uVar56 + (long)local_d8);
          uVar17 = 1;
          sVar55 = num_commands;
          do {
            if ((*(byte *)((long)pvVar53 + (ulong)(bVar48 >> 3)) >> (bVar48 & 7) & 1) != 0) {
              bVar50 = *(byte *)((long)pvVar57 + (sVar55 - 2));
              uVar17 = uVar17 + (bVar48 != bVar50);
              bVar48 = bVar50;
            }
            *(byte *)((long)pvVar57 + (sVar55 - 2)) = bVar48;
            pvVar53 = (void *)((long)pvVar53 - uVar56);
            sVar55 = sVar55 - 1;
          } while (sVar55 != 1);
        }
      }
      if (uVar52 != 0) {
        lVar45 = uVar52 - 1;
        auVar60._8_4_ = (int)lVar45;
        auVar60._0_8_ = lVar45;
        auVar60._12_4_ = (int)((ulong)lVar45 >> 0x20);
        auVar60 = auVar60 ^ auVar139;
        lVar45 = 0;
        auVar68 = _DAT_0135a310;
        auVar74 = _DAT_0135a330;
        auVar76 = _DAT_0135a360;
        auVar78 = _DAT_0135a350;
        do {
          auVar96 = auVar68 ^ auVar139;
          iVar121 = auVar60._0_4_;
          iVar120 = -(uint)(iVar121 < auVar96._0_4_);
          iVar64 = auVar60._4_4_;
          auVar89._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
          iVar129 = auVar60._8_4_;
          iVar128 = -(uint)(iVar129 < auVar96._8_4_);
          iVar65 = auVar60._12_4_;
          auVar89._12_4_ = -(uint)(iVar65 < auVar96._12_4_);
          auVar111._4_4_ = iVar120;
          auVar111._0_4_ = iVar120;
          auVar111._8_4_ = iVar128;
          auVar111._12_4_ = iVar128;
          auVar134 = pshuflw(in_XMM8,auVar111,0xe8);
          auVar88._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
          auVar88._12_4_ = -(uint)(auVar96._12_4_ == iVar65);
          auVar88._0_4_ = auVar88._4_4_;
          auVar88._8_4_ = auVar88._12_4_;
          auVar138 = pshuflw(in_XMM9,auVar88,0xe8);
          auVar89._0_4_ = auVar89._4_4_;
          auVar89._8_4_ = auVar89._12_4_;
          auVar96 = pshuflw(auVar134,auVar89,0xe8);
          auVar132._8_4_ = 0xffffffff;
          auVar132._0_8_ = 0xffffffffffffffff;
          auVar132._12_4_ = 0xffffffff;
          auVar132 = (auVar96 | auVar138 & auVar134) ^ auVar132;
          auVar96 = packssdw(auVar132,auVar132);
          if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45) = 0x100;
          }
          auVar89 = auVar88 & auVar111 | auVar89;
          auVar96 = packssdw(auVar89,auVar89);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar9,auVar96 ^ auVar9);
          if ((auVar96._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 2) = 0x100;
          }
          auVar96 = auVar74 ^ auVar139;
          iVar120 = -(uint)(iVar121 < auVar96._0_4_);
          auVar124._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
          iVar128 = -(uint)(iVar129 < auVar96._8_4_);
          auVar124._12_4_ = -(uint)(iVar65 < auVar96._12_4_);
          auVar90._4_4_ = iVar120;
          auVar90._0_4_ = iVar120;
          auVar90._8_4_ = iVar128;
          auVar90._12_4_ = iVar128;
          auVar112._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
          auVar112._12_4_ = -(uint)(auVar96._12_4_ == iVar65);
          auVar112._0_4_ = auVar112._4_4_;
          auVar112._8_4_ = auVar112._12_4_;
          auVar124._0_4_ = auVar124._4_4_;
          auVar124._8_4_ = auVar124._12_4_;
          auVar96 = auVar112 & auVar90 | auVar124;
          auVar96 = packssdw(auVar96,auVar96);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar10,auVar96 ^ auVar10);
          if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 4) = 0x100;
          }
          auVar100 = pshufhw(auVar90,auVar90,0x84);
          auVar117 = pshufhw(auVar112,auVar112,0x84);
          auVar101 = pshufhw(auVar100,auVar124,0x84);
          auVar91._8_4_ = 0xffffffff;
          auVar91._0_8_ = 0xffffffffffffffff;
          auVar91._12_4_ = 0xffffffff;
          auVar91 = (auVar101 | auVar117 & auVar100) ^ auVar91;
          auVar100 = packssdw(auVar91,auVar91);
          if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 6) = 0x100;
          }
          auVar100 = auVar76 ^ auVar139;
          iVar120 = -(uint)(iVar121 < auVar100._0_4_);
          auVar93._4_4_ = -(uint)(iVar64 < auVar100._4_4_);
          iVar128 = -(uint)(iVar129 < auVar100._8_4_);
          auVar93._12_4_ = -(uint)(iVar65 < auVar100._12_4_);
          auVar113._4_4_ = iVar120;
          auVar113._0_4_ = iVar120;
          auVar113._8_4_ = iVar128;
          auVar113._12_4_ = iVar128;
          auVar96 = pshuflw(auVar96,auVar113,0xe8);
          auVar92._4_4_ = -(uint)(auVar100._4_4_ == iVar64);
          auVar92._12_4_ = -(uint)(auVar100._12_4_ == iVar65);
          auVar92._0_4_ = auVar92._4_4_;
          auVar92._8_4_ = auVar92._12_4_;
          in_XMM9 = pshuflw(auVar138 & auVar134,auVar92,0xe8);
          in_XMM9 = in_XMM9 & auVar96;
          auVar93._0_4_ = auVar93._4_4_;
          auVar93._8_4_ = auVar93._12_4_;
          auVar96 = pshuflw(auVar96,auVar93,0xe8);
          auVar133._8_4_ = 0xffffffff;
          auVar133._0_8_ = 0xffffffffffffffff;
          auVar133._12_4_ = 0xffffffff;
          auVar133 = (auVar96 | in_XMM9) ^ auVar133;
          auVar96 = packssdw(auVar133,auVar133);
          if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 8) = 0x100;
          }
          auVar93 = auVar92 & auVar113 | auVar93;
          auVar96 = packssdw(auVar93,auVar93);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar11,auVar96 ^ auVar11);
          if ((auVar96 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 10) = 0x100;
          }
          auVar96 = auVar78 ^ auVar139;
          iVar121 = -(uint)(iVar121 < auVar96._0_4_);
          auVar125._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
          iVar129 = -(uint)(iVar129 < auVar96._8_4_);
          auVar125._12_4_ = -(uint)(iVar65 < auVar96._12_4_);
          auVar94._4_4_ = iVar121;
          auVar94._0_4_ = iVar121;
          auVar94._8_4_ = iVar129;
          auVar94._12_4_ = iVar129;
          auVar114._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
          auVar114._12_4_ = -(uint)(auVar96._12_4_ == iVar65);
          auVar114._0_4_ = auVar114._4_4_;
          auVar114._8_4_ = auVar114._12_4_;
          auVar125._0_4_ = auVar125._4_4_;
          auVar125._8_4_ = auVar125._12_4_;
          auVar96 = auVar114 & auVar94 | auVar125;
          auVar96 = packssdw(auVar96,auVar96);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar96 ^ auVar12,auVar96 ^ auVar12);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 0xc) = 0x100;
          }
          auVar96 = pshufhw(auVar94,auVar94,0x84);
          auVar138 = pshufhw(auVar114,auVar114,0x84);
          auVar134 = pshufhw(auVar96,auVar125,0x84);
          auVar95._8_4_ = 0xffffffff;
          auVar95._0_8_ = 0xffffffffffffffff;
          auVar95._12_4_ = 0xffffffff;
          auVar95 = (auVar134 | auVar138 & auVar96) ^ auVar95;
          auVar96 = packssdw(auVar95,auVar95);
          if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 0xe) = 0x100;
          }
          lVar72 = auVar68._8_8_;
          auVar68._0_8_ = auVar68._0_8_ + 8;
          auVar68._8_8_ = lVar72 + 8;
          lVar72 = auVar74._8_8_;
          auVar74._0_8_ = auVar74._0_8_ + 8;
          auVar74._8_8_ = lVar72 + 8;
          lVar72 = auVar76._8_8_;
          auVar76._0_8_ = auVar76._0_8_ + 8;
          auVar76._8_8_ = lVar72 + 8;
          lVar72 = auVar78._8_8_;
          auVar78._0_8_ = auVar78._0_8_ + 8;
          auVar78._8_8_ = lVar72 + 8;
          lVar45 = lVar45 + 0x10;
        } while (uVar56 * 0x10 != lVar45);
      }
      sVar55 = 0;
      uVar15 = 0;
      do {
        if (*(short *)((long)pvVar29 + (ulong)*(byte *)((long)pvVar57 + sVar55) * 2) == 0x100) {
          *(ushort *)((long)pvVar29 + (ulong)*(byte *)((long)pvVar57 + sVar55) * 2) = uVar15;
          uVar15 = uVar15 + 1;
        }
        sVar55 = sVar55 + 1;
      } while (num_commands != sVar55);
      sVar55 = 0;
      do {
        *(undefined1 *)((long)pvVar57 + sVar55) =
             *(undefined1 *)((long)pvVar29 + (ulong)*(byte *)((long)pvVar57 + sVar55) * 2);
        sVar55 = sVar55 + 1;
      } while (num_commands != sVar55);
      uVar52 = (ulong)uVar15;
      if (uVar15 != 0) {
        lVar45 = 0;
        do {
          switchD_005700f1::default((void *)((long)pvVar24 + lVar45),0,0xb08);
          *(undefined8 *)((long)pvVar24 + lVar45 + 0xb08) = 0x7ff0000000000000;
          lVar45 = lVar45 + 0xb10;
        } while (uVar52 * 0xb10 != lVar45);
      }
      sVar55 = 0;
      do {
        lVar45 = (ulong)*(byte *)((long)pvVar57 + sVar55) * 0xb10;
        piVar1 = (int *)((long)pvVar24 + (ulong)*(ushort *)((long)pvVar21 + sVar55 * 2) * 4 + lVar45
                        );
        *piVar1 = *piVar1 + 1;
        plVar2 = (long *)((long)pvVar24 + lVar45 + 0xb00);
        *plVar2 = *plVar2 + 1;
        sVar55 = sVar55 + 1;
      } while (num_commands != sVar55);
      lVar40 = lVar40 + 1;
    } while (lVar40 != lVar43);
    BrotliFree(m,pvVar27);
    BrotliFree(m,pvVar28);
    BrotliFree(m,local_d8);
    BrotliFree(m,pvVar29);
    BrotliFree(m,pvVar24);
    if (uVar17 == 0) {
      local_d0 = (uint32_t *)0x0;
    }
    else {
      local_d0 = (uint32_t *)BrotliAllocate(m,uVar17 * 4);
    }
    lVar43 = uVar17 + 0x100;
    if (lVar43 == 0) {
      puVar20 = (uint32_t *)0x0;
    }
    else {
      puVar20 = (uint32_t *)BrotliAllocate(m,lVar43 * 4);
    }
    uVar56 = uVar17 * 0x10 + 0x3f0;
    uVar52 = uVar56 >> 6;
    if (uVar56 < 0x40) {
      local_58 = (HistogramCommand *)0x0;
      puVar36 = (uint32_t *)0x0;
    }
    else {
      local_58 = (HistogramCommand *)BrotliAllocate(m,uVar52 * 0xb10);
      puVar36 = (uint32_t *)BrotliAllocate(m,uVar52 * 4);
    }
    if (uVar17 == 0) {
      local_f0 = (HistogramCommand *)0x0;
    }
    else {
      uVar56 = 0x40;
      if (uVar17 < 0x40) {
        uVar56 = uVar17;
      }
      local_f0 = (HistogramCommand *)BrotliAllocate(m,uVar56 * 0xb10);
    }
    local_60 = (HistogramPair *)BrotliAllocate(m,0xc018);
    tmp_00 = (HistogramCommand *)BrotliAllocate(m,0x1620);
    lVar40 = 0;
    switchD_005700f1::default(puVar20,0,lVar43 * 4);
    sVar55 = 0;
    do {
      puVar20[lVar40 + 0x100] = puVar20[lVar40 + 0x100] + 1;
      if ((sVar37 == sVar55) ||
         (*(char *)((long)pvVar57 + sVar55) != *(char *)((long)pvVar57 + sVar55 + 1))) {
        lVar40 = lVar40 + 1;
      }
      sVar55 = sVar55 + 1;
    } while (num_commands != sVar55);
    if (uVar17 == 0) {
      uVar56 = 0;
    }
    else {
      local_98 = 0;
      local_88 = 0;
      uVar56 = 0;
      lVar43 = 0;
      uVar32 = 0;
      uVar25 = uVar17;
      puVar35 = local_d0;
      uVar34 = uVar52;
      do {
        uVar41 = 0x40;
        if (uVar25 < 0x40) {
          uVar41 = uVar25;
        }
        lVar40 = uVar41 + (uVar41 == 0);
        lVar45 = 0;
        do {
          uVar41 = (ulong)puVar20[uVar32 + lVar45 + 0x100];
          pHVar23 = local_f0 + lVar45;
          switchD_005700f1::default(pHVar23,0,0xb08);
          local_f0[lVar45].bit_cost_ = INFINITY;
          if (uVar41 != 0) {
            sVar37 = pHVar23->total_count_;
            uVar38 = uVar41;
            do {
              lVar72 = lVar43 * 2;
              lVar43 = lVar43 + 1;
              pHVar23->data_[*(ushort *)((long)pvVar21 + lVar72)] =
                   pHVar23->data_[*(ushort *)((long)pvVar21 + lVar72)] + 1;
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
            pHVar23->total_count_ = sVar37 + uVar41;
          }
          dVar58 = BrotliPopulationCostCommand(pHVar23);
          pHVar23->bit_cost_ = dVar58;
          puVar20[lVar45 + 0x40] = (uint32_t)lVar45;
          puVar20[lVar45 + 0x80] = (uint32_t)lVar45;
          puVar20[lVar45] = 1;
          lVar45 = lVar45 + 1;
        } while (lVar45 != lVar40);
        sVar37 = uVar17 - uVar32;
        if (0x3f < sVar37) {
          sVar37 = 0x40;
        }
        sVar37 = BrotliHistogramCombineCommand
                           (local_f0,tmp_00,puVar20,puVar20 + 0x80,puVar20 + 0x40,local_60,sVar37,
                            sVar37,0x40,0x800);
        uVar41 = local_98 + sVar37;
        if (uVar34 < uVar41) {
          uVar38 = uVar34;
          if (uVar34 == 0) {
            uVar38 = uVar41;
          }
          do {
            uVar39 = uVar38;
            uVar38 = uVar39 * 2;
          } while (uVar39 < uVar41);
          if (uVar39 == 0) {
            pHVar23 = (HistogramCommand *)0x0;
          }
          else {
            pHVar23 = (HistogramCommand *)BrotliAllocate(m,uVar39 * 0xb10);
          }
          if (uVar34 != 0) {
            switchD_00b1422a::default(pHVar23,local_58,uVar34 * 0xb10);
          }
          BrotliFree(m,local_58);
          local_58 = pHVar23;
          uVar34 = uVar39;
        }
        uVar41 = local_88 + sVar37;
        if (uVar52 < uVar41) {
          uVar38 = uVar52;
          if (uVar52 == 0) {
            uVar38 = uVar41;
          }
          do {
            uVar39 = uVar38;
            uVar38 = uVar39 * 2;
          } while (uVar39 < uVar41);
          if (uVar39 == 0) {
            puVar33 = (uint32_t *)0x0;
          }
          else {
            puVar33 = (uint32_t *)BrotliAllocate(m,uVar39 * 4);
          }
          if (uVar52 != 0) {
            switchD_00b1422a::default(puVar33,puVar36,uVar52 << 2);
          }
          BrotliFree(m,puVar36);
          uVar52 = uVar39;
          puVar36 = puVar33;
        }
        if (sVar37 != 0) {
          pHVar23 = local_58 + local_98;
          sVar55 = 0;
          do {
            switchD_00b1422a::default(pHVar23,local_f0 + puVar20[sVar55 + 0x40],0xb10);
            puVar36[local_88 + sVar55] = puVar20[puVar20[sVar55 + 0x40]];
            puVar20[(ulong)puVar20[sVar55 + 0x40] + 0xc0] = (uint32_t)sVar55;
            sVar55 = sVar55 + 1;
            pHVar23 = pHVar23 + 1;
          } while (sVar37 != sVar55);
          local_98 = local_98 + sVar55;
          local_88 = local_88 + sVar55;
        }
        lVar45 = 0;
        do {
          puVar35[lVar45] = puVar20[(ulong)puVar20[lVar45 + 0x80] + 0xc0] + (int)uVar56;
          lVar45 = lVar45 + 1;
        } while (lVar40 != lVar45);
        uVar56 = uVar56 + sVar37;
        uVar32 = uVar32 + 0x40;
        uVar25 = uVar25 - 0x40;
        puVar35 = puVar35 + 0x40;
      } while (uVar32 < uVar17);
    }
    BrotliFree(m,local_f0);
    uVar52 = (uVar56 >> 1) * uVar56;
    if (uVar56 << 6 < uVar52) {
      uVar52 = uVar56 << 6;
    }
    if (0x800 < uVar52) {
      BrotliFree(m,local_60);
      local_60 = (HistogramPair *)BrotliAllocate(m,uVar52 * 0x18 + 0x18);
    }
    if (uVar56 == 0) {
      puVar35 = (uint32_t *)0x0;
    }
    else {
      puVar35 = (uint32_t *)BrotliAllocate(m,uVar56 * 4);
      auVar96 = _DAT_0135a320;
      auVar139 = _DAT_01352200;
      lVar43 = uVar56 - 1;
      auVar61._8_4_ = (int)lVar43;
      auVar61._0_8_ = lVar43;
      auVar61._12_4_ = (int)((ulong)lVar43 >> 0x20);
      uVar25 = 0;
      auVar61 = auVar61 ^ _DAT_01352200;
      auVar69 = _DAT_0135a310;
      do {
        bVar4 = auVar61._0_4_ < SUB164(auVar69 ^ auVar139,0);
        iVar121 = auVar61._4_4_;
        iVar64 = SUB164(auVar69 ^ auVar139,4);
        if ((bool)(~(iVar121 < iVar64 || iVar64 == iVar121 && bVar4) & 1)) {
          puVar35[uVar25] = (uint32_t)uVar25;
        }
        if (iVar121 >= iVar64 && (iVar64 != iVar121 || !bVar4)) {
          puVar35[uVar25 + 1] = (uint32_t)uVar25 + 1;
        }
        uVar25 = uVar25 + 2;
        lVar43 = auVar69._8_8_;
        auVar69._0_8_ = auVar69._0_8_ + auVar96._0_8_;
        auVar69._8_8_ = lVar43 + auVar96._8_8_;
      } while ((uVar56 + 1 & 0xfffffffffffffffe) != uVar25);
    }
    sVar37 = BrotliHistogramCombineCommand
                       (local_58,tmp_00,puVar36,local_d0,puVar35,local_60,uVar56,uVar17,0x100,uVar52
                       );
    BrotliFree(m,local_60);
    BrotliFree(m,puVar36);
    if (uVar56 == 0) {
      local_108 = (void *)0x0;
    }
    else {
      local_108 = BrotliAllocate(m,uVar56 * 4);
      switchD_005700f1::default(local_108,0xff,uVar56 << 2);
    }
    if (uVar17 != 0) {
      iVar121 = 0;
      local_100 = 0;
      uVar52 = 0;
      do {
        switchD_005700f1::default(tmp_00,0,0xb08);
        tmp_00->bit_cost_ = INFINITY;
        if (puVar20[uVar52 + 0x100] != 0) {
          sVar55 = tmp_00->total_count_;
          uVar56 = 0;
          do {
            tmp_00->data_[*(ushort *)((long)pvVar21 + uVar56 * 2 + local_100 * 2)] =
                 tmp_00->data_[*(ushort *)((long)pvVar21 + uVar56 * 2 + local_100 * 2)] + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 < puVar20[uVar52 + 0x100]);
          tmp_00->total_count_ = sVar55 + uVar56;
          local_100 = local_100 + uVar56;
        }
        lVar43 = 0;
        if (uVar52 != 0) {
          lVar43 = uVar52 - 1;
        }
        uVar51 = local_d0[lVar43];
        uVar56 = (ulong)uVar51;
        local_f0 = (HistogramCommand *)
                   BrotliHistogramBitCostDistanceCommand(tmp_00,local_58 + uVar56,tmp_00 + 1);
        if (sVar37 != 0) {
          sVar55 = 0;
          do {
            dVar58 = BrotliHistogramBitCostDistanceCommand
                               (tmp_00,local_58 + puVar35[sVar55],tmp_00 + 1);
            if (dVar58 < (double)local_f0) {
              uVar56 = (ulong)puVar35[sVar55];
              local_f0 = (HistogramCommand *)dVar58;
            }
            uVar51 = (uint)uVar56;
            sVar55 = sVar55 + 1;
          } while (sVar37 != sVar55);
        }
        local_d0[uVar52] = uVar51;
        if (*(int *)((long)local_108 + (ulong)uVar51 * 4) == -1) {
          *(int *)((long)local_108 + (ulong)uVar51 * 4) = iVar121;
          iVar121 = iVar121 + 1;
        }
        uVar52 = uVar52 + 1;
      } while (uVar52 != uVar17);
    }
    BrotliFree(m,tmp_00);
    BrotliFree(m,puVar35);
    BrotliFree(m,local_58);
    uVar52 = insert_and_copy_split->types_alloc_size;
    if (uVar52 < uVar17) {
      if (uVar52 == 0) {
        uVar52 = uVar17;
      }
      do {
        uVar56 = uVar52;
        uVar52 = uVar56 * 2;
      } while (uVar56 < uVar17);
      if (uVar56 == 0) {
        puVar18 = (uint8_t *)0x0;
      }
      else {
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar56);
      }
      if (insert_and_copy_split->types_alloc_size != 0) {
        switchD_00b1422a::default
                  (puVar18,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
      }
      BrotliFree(m,insert_and_copy_split->types);
      insert_and_copy_split->types = puVar18;
      insert_and_copy_split->types_alloc_size = uVar56;
    }
    uVar52 = insert_and_copy_split->lengths_alloc_size;
    if (uVar52 < uVar17) {
      if (uVar52 == 0) {
        uVar52 = uVar17;
      }
      do {
        uVar56 = uVar52;
        uVar52 = uVar56 * 2;
      } while (uVar56 < uVar17);
      if (uVar56 == 0) {
        puVar36 = (uint32_t *)0x0;
      }
      else {
        puVar36 = (uint32_t *)BrotliAllocate(m,uVar56 * 4);
      }
      if (insert_and_copy_split->lengths_alloc_size != 0) {
        switchD_00b1422a::default
                  (puVar36,insert_and_copy_split->lengths,
                   insert_and_copy_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,insert_and_copy_split->lengths);
      insert_and_copy_split->lengths = puVar36;
      insert_and_copy_split->lengths_alloc_size = uVar56;
    }
    uVar42 = 0;
    if (uVar17 == 0) {
      sVar55 = 1;
      sVar37 = 0;
    }
    else {
      uVar51 = 0;
      sVar37 = 0;
      uVar52 = 0;
      do {
        uVar42 = uVar42 + puVar20[uVar52 + 0x100];
        if ((uVar17 - 1 == uVar52) || (local_d0[uVar52] != local_d0[uVar52 + 1])) {
          uVar49 = uVar51 & 0xff;
          uVar3 = *(uint *)((long)local_108 + (ulong)local_d0[uVar52] * 4);
          bVar50 = (byte)uVar3;
          insert_and_copy_split->types[sVar37] = bVar50;
          bVar48 = (byte)uVar51;
          uVar51 = uVar3;
          if (bVar50 < bVar48) {
            uVar51 = uVar49;
          }
          insert_and_copy_split->lengths[sVar37] = uVar42;
          sVar37 = sVar37 + 1;
          uVar42 = 0;
        }
        uVar52 = uVar52 + 1;
      } while (uVar17 != uVar52);
      sVar55 = (ulong)(uVar51 & 0xff) + 1;
    }
    insert_and_copy_split->num_blocks = sVar37;
    insert_and_copy_split->num_types = sVar55;
    BrotliFree(m,local_108);
    BrotliFree(m,puVar20);
    BrotliFree(m,local_d0);
    BrotliFree(m,pvVar57);
  }
  BrotliFree(m,pvVar21);
  if (num_commands == 0) {
    pvVar21 = (void *)0x0;
    local_108 = (void *)0x0;
  }
  else {
    pvVar21 = BrotliAllocate(m,num_commands * 2);
    puVar22 = &cmds->dist_prefix_;
    local_108 = (void *)0x0;
    do {
      if (((*(uint *)(puVar22 + -5) & 0x1ffffff) != 0) && (0x7f < puVar22[-1])) {
        *(uint16_t *)((long)pvVar21 + (long)local_108 * 2) = *puVar22 & 0x3ff;
        local_108 = (void *)((long)local_108 + 1);
      }
      puVar22 = puVar22 + 8;
      num_commands = num_commands - 1;
    } while (num_commands != 0);
  }
  uVar52 = 0x32;
  if (local_108 < 0x6a40) {
    uVar52 = (ulong)local_108 / 0x220 + 1;
  }
  if (local_108 == (void *)0x0) {
    dist_split->num_types = 1;
  }
  else if (local_108 < 0x80) {
    uVar52 = dist_split->types_alloc_size;
    uVar56 = dist_split->num_blocks + 1;
    if (uVar52 < uVar56) {
      if (uVar52 == 0) {
        uVar52 = uVar56;
      }
      do {
        uVar17 = uVar52;
        uVar52 = uVar17 * 2;
      } while (uVar17 < uVar56);
      if (uVar17 == 0) {
        puVar18 = (uint8_t *)0x0;
      }
      else {
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar17);
      }
      if (dist_split->types_alloc_size != 0) {
        switchD_00b1422a::default(puVar18,dist_split->types,dist_split->types_alloc_size);
      }
      BrotliFree(m,dist_split->types);
      dist_split->types = puVar18;
      dist_split->types_alloc_size = uVar17;
    }
    uVar52 = dist_split->lengths_alloc_size;
    uVar56 = dist_split->num_blocks + 1;
    if (uVar52 < uVar56) {
      if (uVar52 == 0) {
        uVar52 = uVar56;
      }
      do {
        uVar17 = uVar52;
        uVar52 = uVar17 * 2;
      } while (uVar17 < uVar56);
      if (uVar17 == 0) {
        puVar20 = (uint32_t *)0x0;
      }
      else {
        puVar20 = (uint32_t *)BrotliAllocate(m,uVar17 * 4);
      }
      if (dist_split->lengths_alloc_size != 0) {
        switchD_00b1422a::default(puVar20,dist_split->lengths,dist_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,dist_split->lengths);
      dist_split->lengths = puVar20;
      dist_split->lengths_alloc_size = uVar17;
    }
    dist_split->num_types = 1;
    dist_split->types[dist_split->num_blocks] = '\0';
    sVar37 = dist_split->num_blocks;
    dist_split->lengths[sVar37] = (uint32_t)local_108;
    dist_split->num_blocks = sVar37 + 1;
  }
  else {
    pvVar24 = BrotliAllocate(m,uVar52 * 0x890 + 0x890);
    uVar56 = uVar52;
    pvVar57 = pvVar24;
    do {
      switchD_005700f1::default(pvVar57,0,0x888);
      *(undefined8 *)((long)pvVar57 + 0x888) = 0x7ff0000000000000;
      pvVar57 = (void *)((long)pvVar57 + 0x890);
      uVar56 = uVar56 - 1;
    } while (uVar56 != 0);
    uVar17 = 0;
    uVar56 = 7;
    do {
      uVar25 = (uVar17 * (long)local_108) / uVar52;
      if (uVar17 != 0) {
        uVar56 = (ulong)(uint)((int)uVar56 * 0x41a7);
        uVar25 = uVar25 + uVar56 % ((ulong)local_108 / uVar52);
      }
      if (local_108 <= uVar25 + 0x28) {
        uVar25 = (long)local_108 - 0x29;
      }
      plVar2 = (long *)((long)pvVar24 + uVar17 * 0x890 + 0x880);
      *plVar2 = *plVar2 + 0x28;
      lVar43 = 0;
      do {
        piVar1 = (int *)((long)pvVar24 +
                        (ulong)*(ushort *)((long)pvVar21 + lVar43 * 2 + uVar25 * 2) * 4 +
                        uVar17 * 0x890);
        *piVar1 = *piVar1 + 1;
        lVar43 = lVar43 + 1;
      } while (lVar43 != 0x28);
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar52);
    uVar56 = (ulong)((long)local_108 * 2) / 0x28 + uVar52 + 99;
    if (uVar56 != uVar56 % uVar52) {
      pvVar57 = (void *)(uVar52 * 0x890 + (long)pvVar24);
      uVar25 = 7;
      uVar17 = 0;
      do {
        switchD_005700f1::default(pvVar57,0,0x880);
        uVar25 = (ulong)(uint)((int)uVar25 * 0x41a7);
        puVar26 = (ushort *)((long)pvVar21 + (uVar25 % ((long)local_108 - 0x27U)) * 2);
        *(undefined8 *)((long)pvVar57 + 0x880) = 0x28;
        lVar43 = -0x28;
        do {
          uVar15 = *puVar26;
          puVar26 = puVar26 + 1;
          piVar1 = (int *)((long)pvVar57 + (ulong)uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = lVar43 + 1;
        } while (lVar43 != 0);
        lVar43 = (uVar17 % uVar52) * 0x890;
        plVar2 = (long *)((long)pvVar24 + lVar43 + 0x880);
        *plVar2 = *plVar2 + 0x28;
        lVar40 = 0;
        do {
          piVar1 = (int *)((long)pvVar24 + lVar40 * 4 + lVar43);
          *piVar1 = *piVar1 + *(int *)((long)pvVar57 + lVar40 * 4);
          lVar40 = lVar40 + 1;
        } while (lVar40 != 0x220);
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar56 - uVar56 % uVar52);
      *(undefined8 *)((long)pvVar57 + 0x888) = 0x7ff0000000000000;
    }
    pvVar57 = BrotliAllocate(m,(size_t)local_108);
    pvVar27 = BrotliAllocate(m,uVar52 * 0x1100);
    pvVar28 = BrotliAllocate(m,uVar52 * 8);
    sVar37 = (uVar52 + 7 >> 3) * (long)local_108;
    if (sVar37 == 0) {
      local_a0 = (void *)0x0;
    }
    else {
      local_a0 = BrotliAllocate(m,sVar37);
    }
    pvVar29 = BrotliAllocate(m,uVar52 * 2);
    lVar43 = 3;
    if (10 < params->quality) {
      lVar43 = 10;
    }
    uVar56 = (long)local_108 - 1;
    lVar40 = 0;
    do {
      uVar17 = uVar52 + 7 >> 3;
      if (uVar52 < 2) {
        switchD_005700f1::default(pvVar57,0,(size_t)local_108);
        uVar25 = 1;
        auVar139 = _DAT_01352200;
      }
      else {
        switchD_005700f1::default(pvVar27,0,uVar52 * 0x1100);
        uVar25 = 0;
        puVar54 = (uint *)((long)pvVar24 + 0x880);
        do {
          uVar34 = (ulong)*puVar54;
          if (uVar34 < 0x100) {
            dVar58 = (double)(&kBrotliLog2Table)[uVar34];
          }
          else {
            dVar58 = log2((double)uVar34);
          }
          *(double *)((long)pvVar27 + uVar25 * 8) = dVar58;
          uVar25 = uVar25 + 1;
          puVar54 = puVar54 + 0x224;
        } while (uVar52 != uVar25);
        pvVar53 = (void *)(uVar52 * 0x10f8 + (long)pvVar27);
        lVar45 = 0x220;
        puVar54 = (uint *)((long)pvVar24 + 0x87c);
        do {
          lVar45 = lVar45 + -1;
          uVar25 = 0;
          puVar47 = puVar54;
          do {
            dVar66 = -2.0;
            dVar58 = *(double *)((long)pvVar27 + uVar25 * 8);
            uVar34 = (ulong)*puVar47;
            if (uVar34 != 0) {
              if (*puVar47 < 0x100) {
                dVar66 = (double)(&kBrotliLog2Table)[uVar34];
              }
              else {
                dVar66 = log2((double)uVar34);
              }
            }
            *(double *)((long)pvVar53 + uVar25 * 8) = dVar58 - dVar66;
            uVar25 = uVar25 + 1;
            puVar47 = puVar47 + 0x224;
          } while (uVar52 != uVar25);
          pvVar53 = (void *)((long)pvVar53 + uVar52 * -8);
          puVar54 = puVar54 + -1;
        } while (lVar45 != 0);
        switchD_005700f1::default(pvVar28,0,uVar52 * 8);
        switchD_005700f1::default(local_a0,0,uVar17 * (long)local_108);
        auVar139 = _DAT_01352200;
        uVar25 = 0;
        do {
          uVar15 = *(ushort *)((long)pvVar21 + uVar25 * 2);
          uVar34 = 0;
          dVar58 = 1e+99;
          do {
            dVar66 = *(double *)((long)pvVar27 + uVar34 * 8 + uVar15 * uVar52 * 8) +
                     *(double *)((long)pvVar28 + uVar34 * 8);
            *(double *)((long)pvVar28 + uVar34 * 8) = dVar66;
            if (dVar66 < dVar58) {
              *(char *)((long)pvVar57 + uVar25) = (char)uVar34;
              dVar58 = dVar66;
            }
            uVar34 = uVar34 + 1;
          } while (uVar52 != uVar34);
          dVar66 = 14.6;
          if (uVar25 < 2000) {
            dVar66 = (((double)(long)uVar25 * 0.07) / 2000.0 + 0.77) * 14.6;
          }
          uVar34 = 0;
          do {
            dVar73 = *(double *)((long)pvVar28 + uVar34 * 8) - dVar58;
            *(double *)((long)pvVar28 + uVar34 * 8) = dVar73;
            if (dVar66 <= dVar73) {
              *(double *)((long)pvVar28 + uVar34 * 8) = dVar66;
              pbVar44 = (byte *)((long)local_a0 + (uVar34 >> 3) + uVar25 * uVar17);
              *pbVar44 = *pbVar44 | '\x01' << ((byte)uVar34 & 7);
            }
            uVar34 = uVar34 + 1;
          } while (uVar52 != uVar34);
          uVar25 = uVar25 + 1;
        } while ((void *)uVar25 != local_108);
        if (uVar56 == 0) {
          uVar25 = 1;
        }
        else {
          bVar48 = *(byte *)((long)pvVar57 + uVar56);
          pvVar30 = (void *)(((long)local_108 - 2U) * uVar17 + (long)local_a0);
          uVar25 = 1;
          pvVar53 = local_108;
          do {
            if ((*(byte *)((long)pvVar30 + (ulong)(bVar48 >> 3)) >> (bVar48 & 7) & 1) != 0) {
              bVar50 = *(byte *)((long)pvVar57 + ((long)pvVar53 - 2U));
              uVar25 = uVar25 + (bVar48 != bVar50);
              bVar48 = bVar50;
            }
            *(byte *)((long)pvVar57 + ((long)pvVar53 - 2U)) = bVar48;
            pvVar30 = (void *)((long)pvVar30 - uVar17);
            pvVar53 = (void *)((long)pvVar53 - 1);
          } while (pvVar53 != (void *)0x1);
        }
      }
      if (uVar52 != 0) {
        lVar45 = uVar52 - 1;
        auVar62._8_4_ = (int)lVar45;
        auVar62._0_8_ = lVar45;
        auVar62._12_4_ = (int)((ulong)lVar45 >> 0x20);
        auVar62 = auVar62 ^ auVar139;
        lVar45 = 0;
        auVar70 = _DAT_0135a310;
        auVar75 = _DAT_0135a330;
        auVar77 = _DAT_0135a360;
        auVar79 = _DAT_0135a350;
        do {
          auVar96 = auVar70 ^ auVar139;
          iVar121 = auVar62._0_4_;
          iVar120 = -(uint)(iVar121 < auVar96._0_4_);
          iVar64 = auVar62._4_4_;
          auVar98._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
          iVar129 = auVar62._8_4_;
          iVar128 = -(uint)(iVar129 < auVar96._8_4_);
          iVar65 = auVar62._12_4_;
          auVar98._12_4_ = -(uint)(iVar65 < auVar96._12_4_);
          auVar115._4_4_ = iVar120;
          auVar115._0_4_ = iVar120;
          auVar115._8_4_ = iVar128;
          auVar115._12_4_ = iVar128;
          auVar134 = pshuflw(in_XMM8,auVar115,0xe8);
          auVar97._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
          auVar97._12_4_ = -(uint)(auVar96._12_4_ == iVar65);
          auVar97._0_4_ = auVar97._4_4_;
          auVar97._8_4_ = auVar97._12_4_;
          auVar138 = pshuflw(in_XMM9,auVar97,0xe8);
          auVar98._0_4_ = auVar98._4_4_;
          auVar98._8_4_ = auVar98._12_4_;
          auVar96 = pshuflw(auVar134,auVar98,0xe8);
          auVar135._8_4_ = 0xffffffff;
          auVar135._0_8_ = 0xffffffffffffffff;
          auVar135._12_4_ = 0xffffffff;
          auVar135 = (auVar96 | auVar138 & auVar134) ^ auVar135;
          auVar96 = packssdw(auVar135,auVar135);
          if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45) = 0x100;
          }
          auVar98 = auVar97 & auVar115 | auVar98;
          auVar96 = packssdw(auVar98,auVar98);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar5,auVar96 ^ auVar5);
          if ((auVar96._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 2) = 0x100;
          }
          auVar96 = auVar75 ^ auVar139;
          iVar120 = -(uint)(iVar121 < auVar96._0_4_);
          auVar126._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
          iVar128 = -(uint)(iVar129 < auVar96._8_4_);
          auVar126._12_4_ = -(uint)(iVar65 < auVar96._12_4_);
          auVar99._4_4_ = iVar120;
          auVar99._0_4_ = iVar120;
          auVar99._8_4_ = iVar128;
          auVar99._12_4_ = iVar128;
          auVar116._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
          auVar116._12_4_ = -(uint)(auVar96._12_4_ == iVar65);
          auVar116._0_4_ = auVar116._4_4_;
          auVar116._8_4_ = auVar116._12_4_;
          auVar126._0_4_ = auVar126._4_4_;
          auVar126._8_4_ = auVar126._12_4_;
          auVar96 = auVar116 & auVar99 | auVar126;
          auVar96 = packssdw(auVar96,auVar96);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar6,auVar96 ^ auVar6);
          if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 4) = 0x100;
          }
          auVar100 = pshufhw(auVar99,auVar99,0x84);
          auVar117 = pshufhw(auVar116,auVar116,0x84);
          auVar101 = pshufhw(auVar100,auVar126,0x84);
          auVar102._8_4_ = 0xffffffff;
          auVar102._0_8_ = 0xffffffffffffffff;
          auVar102._12_4_ = 0xffffffff;
          auVar102 = (auVar101 | auVar117 & auVar100) ^ auVar102;
          auVar100 = packssdw(auVar102,auVar102);
          if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 6) = 0x100;
          }
          auVar100 = auVar77 ^ auVar139;
          iVar120 = -(uint)(iVar121 < auVar100._0_4_);
          auVar104._4_4_ = -(uint)(iVar64 < auVar100._4_4_);
          iVar128 = -(uint)(iVar129 < auVar100._8_4_);
          auVar104._12_4_ = -(uint)(iVar65 < auVar100._12_4_);
          auVar118._4_4_ = iVar120;
          auVar118._0_4_ = iVar120;
          auVar118._8_4_ = iVar128;
          auVar118._12_4_ = iVar128;
          auVar96 = pshuflw(auVar96,auVar118,0xe8);
          auVar103._4_4_ = -(uint)(auVar100._4_4_ == iVar64);
          auVar103._12_4_ = -(uint)(auVar100._12_4_ == iVar65);
          auVar103._0_4_ = auVar103._4_4_;
          auVar103._8_4_ = auVar103._12_4_;
          in_XMM9 = pshuflw(auVar138 & auVar134,auVar103,0xe8);
          in_XMM9 = in_XMM9 & auVar96;
          auVar104._0_4_ = auVar104._4_4_;
          auVar104._8_4_ = auVar104._12_4_;
          auVar96 = pshuflw(auVar96,auVar104,0xe8);
          auVar136._8_4_ = 0xffffffff;
          auVar136._0_8_ = 0xffffffffffffffff;
          auVar136._12_4_ = 0xffffffff;
          auVar136 = (auVar96 | in_XMM9) ^ auVar136;
          auVar96 = packssdw(auVar136,auVar136);
          if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 8) = 0x100;
          }
          auVar104 = auVar103 & auVar118 | auVar104;
          auVar96 = packssdw(auVar104,auVar104);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar7,auVar96 ^ auVar7);
          if ((auVar96 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 10) = 0x100;
          }
          auVar96 = auVar79 ^ auVar139;
          iVar121 = -(uint)(iVar121 < auVar96._0_4_);
          auVar127._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
          iVar129 = -(uint)(iVar129 < auVar96._8_4_);
          auVar127._12_4_ = -(uint)(iVar65 < auVar96._12_4_);
          auVar105._4_4_ = iVar121;
          auVar105._0_4_ = iVar121;
          auVar105._8_4_ = iVar129;
          auVar105._12_4_ = iVar129;
          auVar119._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
          auVar119._12_4_ = -(uint)(auVar96._12_4_ == iVar65);
          auVar119._0_4_ = auVar119._4_4_;
          auVar119._8_4_ = auVar119._12_4_;
          auVar127._0_4_ = auVar127._4_4_;
          auVar127._8_4_ = auVar127._12_4_;
          auVar96 = auVar119 & auVar105 | auVar127;
          auVar96 = packssdw(auVar96,auVar96);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar96 ^ auVar8,auVar96 ^ auVar8);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 0xc) = 0x100;
          }
          auVar96 = pshufhw(auVar105,auVar105,0x84);
          auVar138 = pshufhw(auVar119,auVar119,0x84);
          auVar134 = pshufhw(auVar96,auVar127,0x84);
          auVar106._8_4_ = 0xffffffff;
          auVar106._0_8_ = 0xffffffffffffffff;
          auVar106._12_4_ = 0xffffffff;
          auVar106 = (auVar134 | auVar138 & auVar96) ^ auVar106;
          auVar96 = packssdw(auVar106,auVar106);
          if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar29 + lVar45 + 0xe) = 0x100;
          }
          lVar72 = auVar70._8_8_;
          auVar70._0_8_ = auVar70._0_8_ + 8;
          auVar70._8_8_ = lVar72 + 8;
          lVar72 = auVar75._8_8_;
          auVar75._0_8_ = auVar75._0_8_ + 8;
          auVar75._8_8_ = lVar72 + 8;
          lVar72 = auVar77._8_8_;
          auVar77._0_8_ = auVar77._0_8_ + 8;
          auVar77._8_8_ = lVar72 + 8;
          lVar72 = auVar79._8_8_;
          auVar79._0_8_ = auVar79._0_8_ + 8;
          auVar79._8_8_ = lVar72 + 8;
          lVar45 = lVar45 + 0x10;
        } while (uVar17 * 0x10 != lVar45);
      }
      uVar52 = 0;
      uVar15 = 0;
      do {
        if (*(short *)((long)pvVar29 + (ulong)*(byte *)((long)pvVar57 + uVar52) * 2) == 0x100) {
          *(ushort *)((long)pvVar29 + (ulong)*(byte *)((long)pvVar57 + uVar52) * 2) = uVar15;
          uVar15 = uVar15 + 1;
        }
        uVar52 = uVar52 + 1;
      } while (local_108 != (void *)uVar52);
      uVar52 = 0;
      do {
        *(undefined1 *)((long)pvVar57 + uVar52) =
             *(undefined1 *)((long)pvVar29 + (ulong)*(byte *)((long)pvVar57 + uVar52) * 2);
        uVar52 = uVar52 + 1;
      } while (local_108 != (void *)uVar52);
      uVar52 = (ulong)uVar15;
      if (uVar15 != 0) {
        lVar45 = 0;
        do {
          switchD_005700f1::default((void *)((long)pvVar24 + lVar45),0,0x888);
          *(undefined8 *)((long)pvVar24 + lVar45 + 0x888) = 0x7ff0000000000000;
          lVar45 = lVar45 + 0x890;
        } while (uVar52 * 0x890 - lVar45 != 0);
      }
      uVar17 = 0;
      do {
        lVar45 = (ulong)*(byte *)((long)pvVar57 + uVar17) * 0x890;
        piVar1 = (int *)((long)pvVar24 + (ulong)*(ushort *)((long)pvVar21 + uVar17 * 2) * 4 + lVar45
                        );
        *piVar1 = *piVar1 + 1;
        plVar2 = (long *)((long)pvVar24 + lVar45 + 0x880);
        *plVar2 = *plVar2 + 1;
        uVar17 = uVar17 + 1;
      } while (local_108 != (void *)uVar17);
      lVar40 = lVar40 + 1;
    } while (lVar40 != lVar43);
    BrotliFree(m,pvVar27);
    BrotliFree(m,pvVar28);
    BrotliFree(m,local_a0);
    BrotliFree(m,pvVar29);
    BrotliFree(m,pvVar24);
    if (uVar25 == 0) {
      local_a8 = (uint32_t *)0x0;
    }
    else {
      local_a8 = (uint32_t *)BrotliAllocate(m,uVar25 * 4);
    }
    lVar43 = uVar25 + 0x100;
    if (lVar43 == 0) {
      puVar20 = (uint32_t *)0x0;
    }
    else {
      puVar20 = (uint32_t *)BrotliAllocate(m,lVar43 * 4);
    }
    uVar17 = uVar25 * 0x10 + 0x3f0;
    uVar52 = uVar17 >> 6;
    if (uVar17 < 0x40) {
      local_118 = (HistogramDistance *)0x0;
      puVar36 = (uint32_t *)0x0;
    }
    else {
      local_118 = (HistogramDistance *)BrotliAllocate(m,uVar52 * 0x890);
      puVar36 = (uint32_t *)BrotliAllocate(m,uVar52 * 4);
    }
    if (uVar25 == 0) {
      local_f0 = (HistogramCommand *)0x0;
    }
    else {
      uVar17 = 0x40;
      if (uVar25 < 0x40) {
        uVar17 = uVar25;
      }
      local_f0 = (HistogramCommand *)BrotliAllocate(m,uVar17 * 0x890);
    }
    local_80 = (HistogramPair *)BrotliAllocate(m,0xc018);
    pHVar31 = (HistogramDistance *)BrotliAllocate(m,0x1120);
    lVar40 = 0;
    switchD_005700f1::default(puVar20,0,lVar43 * 4);
    uVar17 = 0;
    do {
      puVar20[lVar40 + 0x100] = puVar20[lVar40 + 0x100] + 1;
      if ((uVar56 == uVar17) ||
         (*(char *)((long)pvVar57 + uVar17) != *(char *)((long)pvVar57 + uVar17 + 1))) {
        lVar40 = lVar40 + 1;
      }
      uVar17 = uVar17 + 1;
    } while (local_108 != (void *)uVar17);
    if (uVar25 == 0) {
      local_d8 = (void *)0x0;
    }
    else {
      local_b8 = 0;
      local_78 = local_118;
      local_98 = 0;
      local_d8 = (void *)0x0;
      lVar43 = 0;
      uVar34 = 0;
      uVar56 = uVar25;
      puVar35 = local_a8;
      uVar17 = uVar52;
      do {
        uVar32 = 0x40;
        if (uVar56 < 0x40) {
          uVar32 = uVar56;
        }
        lVar40 = uVar32 + (uVar32 == 0);
        lVar45 = 0;
        do {
          uVar32 = (ulong)puVar20[uVar34 + lVar45 + 0x100];
          pHVar46 = (HistogramDistance *)((long)local_f0 + lVar45 * 0x890);
          switchD_005700f1::default(pHVar46,0,0x888);
          ((HistogramDistance *)((long)local_f0 + lVar45 * 0x890))->bit_cost_ = INFINITY;
          if (uVar32 != 0) {
            sVar37 = pHVar46->total_count_;
            uVar41 = uVar32;
            do {
              lVar72 = lVar43 * 2;
              lVar43 = lVar43 + 1;
              pHVar46->data_[*(ushort *)((long)pvVar21 + lVar72)] =
                   pHVar46->data_[*(ushort *)((long)pvVar21 + lVar72)] + 1;
              uVar41 = uVar41 - 1;
            } while (uVar41 != 0);
            pHVar46->total_count_ = sVar37 + uVar32;
          }
          dVar58 = BrotliPopulationCostDistance(pHVar46);
          pHVar46->bit_cost_ = dVar58;
          puVar20[lVar45 + 0x40] = (uint32_t)lVar45;
          puVar20[lVar45 + 0x80] = (uint32_t)lVar45;
          puVar20[lVar45] = 1;
          lVar45 = lVar45 + 1;
        } while (lVar45 != lVar40);
        sVar37 = uVar25 - uVar34;
        if (0x3f < sVar37) {
          sVar37 = 0x40;
        }
        sVar37 = BrotliHistogramCombineDistance
                           ((HistogramDistance *)local_f0,pHVar31,puVar20,puVar20 + 0x80,
                            puVar20 + 0x40,local_80,sVar37,sVar37,0x40,0x800);
        uVar32 = local_b8 + sVar37;
        if (uVar52 < uVar32) {
          uVar41 = uVar52;
          if (uVar52 == 0) {
            uVar41 = uVar32;
          }
          do {
            uVar38 = uVar41;
            uVar41 = uVar38 * 2;
          } while (uVar38 < uVar32);
          if (uVar38 == 0) {
            local_118 = (HistogramDistance *)0x0;
          }
          else {
            local_118 = (HistogramDistance *)BrotliAllocate(m,uVar38 * 0x890);
          }
          if (uVar52 != 0) {
            switchD_00b1422a::default(local_118,local_78,uVar52 * 0x890);
          }
          BrotliFree(m,local_78);
          uVar52 = uVar38;
        }
        else {
          local_118 = local_78;
        }
        uVar32 = local_98 + sVar37;
        if (uVar17 < uVar32) {
          uVar41 = uVar17;
          if (uVar17 == 0) {
            uVar41 = uVar32;
          }
          do {
            uVar38 = uVar41;
            uVar41 = uVar38 * 2;
          } while (uVar38 < uVar32);
          if (uVar38 == 0) {
            puVar33 = (uint32_t *)0x0;
          }
          else {
            puVar33 = (uint32_t *)BrotliAllocate(m,uVar38 * 4);
          }
          if (uVar17 != 0) {
            switchD_00b1422a::default(puVar33,puVar36,uVar17 << 2);
          }
          BrotliFree(m,puVar36);
          puVar36 = puVar33;
          uVar17 = uVar38;
        }
        if (sVar37 != 0) {
          pHVar46 = local_118 + local_b8;
          sVar55 = 0;
          do {
            switchD_00b1422a::default
                      (pHVar46,(HistogramDistance *)
                               ((long)local_f0 + (ulong)puVar20[sVar55 + 0x40] * 0x890),0x890);
            puVar36[local_98 + sVar55] = puVar20[puVar20[sVar55 + 0x40]];
            puVar20[(ulong)puVar20[sVar55 + 0x40] + 0xc0] = (uint32_t)sVar55;
            sVar55 = sVar55 + 1;
            pHVar46 = pHVar46 + 1;
          } while (sVar37 != sVar55);
          local_b8 = local_b8 + sVar55;
          local_98 = local_98 + sVar55;
        }
        lVar45 = 0;
        do {
          puVar35[lVar45] = puVar20[(ulong)puVar20[lVar45 + 0x80] + 0xc0] + (int)local_d8;
          lVar45 = lVar45 + 1;
        } while (lVar40 != lVar45);
        local_d8 = (void *)((long)local_d8 + sVar37);
        uVar34 = uVar34 + 0x40;
        uVar56 = uVar56 - 0x40;
        puVar35 = puVar35 + 0x40;
        local_78 = local_118;
      } while (uVar34 < uVar25);
    }
    BrotliFree(m,local_f0);
    uVar52 = ((ulong)local_d8 >> 1) * (long)local_d8;
    if ((ulong)((long)local_d8 << 6) < uVar52) {
      uVar52 = (long)local_d8 << 6;
    }
    if (0x800 < uVar52) {
      BrotliFree(m,local_80);
      local_80 = (HistogramPair *)BrotliAllocate(m,uVar52 * 0x18 + 0x18);
    }
    if (local_d8 == (void *)0x0) {
      puVar35 = (uint32_t *)0x0;
    }
    else {
      puVar35 = (uint32_t *)BrotliAllocate(m,(long)local_d8 * 4);
      auVar139 = _DAT_01352200;
      lVar43 = (long)local_d8 - 1;
      auVar63._8_4_ = (int)lVar43;
      auVar63._0_8_ = lVar43;
      auVar63._12_4_ = (int)((ulong)lVar43 >> 0x20);
      uVar56 = 0;
      auVar63 = auVar63 ^ _DAT_01352200;
      auVar71 = _DAT_0135a310;
      do {
        auVar96 = auVar71 ^ auVar139;
        if ((bool)(~(auVar96._4_4_ == auVar63._4_4_ && auVar63._0_4_ < auVar96._0_4_ ||
                    auVar63._4_4_ < auVar96._4_4_) & 1)) {
          puVar35[uVar56] = (uint32_t)uVar56;
        }
        if ((auVar96._12_4_ != auVar63._12_4_ || auVar96._8_4_ <= auVar63._8_4_) &&
            auVar96._12_4_ <= auVar63._12_4_) {
          puVar35[uVar56 + 1] = (uint32_t)uVar56 + 1;
        }
        uVar56 = uVar56 + 2;
        lVar43 = auVar71._8_8_;
        auVar71._0_8_ = auVar71._0_8_ + 2;
        auVar71._8_8_ = lVar43 + 2;
      } while (((long)local_d8 + 1U & 0xfffffffffffffffe) != uVar56);
    }
    sVar37 = BrotliHistogramCombineDistance
                       (local_118,pHVar31,puVar36,local_a8,puVar35,local_80,(size_t)local_d8,uVar25,
                        0x100,uVar52);
    BrotliFree(m,local_80);
    BrotliFree(m,puVar36);
    if (local_d8 == (void *)0x0) {
      local_108 = (void *)0x0;
    }
    else {
      local_108 = BrotliAllocate(m,(long)local_d8 * 4);
      switchD_005700f1::default(local_108,0xff,(long)local_d8 << 2);
    }
    if (uVar25 != 0) {
      iVar121 = 0;
      local_100 = 0;
      uVar52 = 0;
      do {
        switchD_005700f1::default(pHVar31,0,0x888);
        pHVar31->bit_cost_ = INFINITY;
        if (puVar20[uVar52 + 0x100] != 0) {
          sVar55 = pHVar31->total_count_;
          uVar56 = 0;
          do {
            pHVar31->data_[*(ushort *)((long)pvVar21 + uVar56 * 2 + local_100 * 2)] =
                 pHVar31->data_[*(ushort *)((long)pvVar21 + uVar56 * 2 + local_100 * 2)] + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 < puVar20[uVar52 + 0x100]);
          pHVar31->total_count_ = sVar55 + uVar56;
          local_100 = local_100 + uVar56;
        }
        lVar43 = 0;
        if (uVar52 != 0) {
          lVar43 = uVar52 - 1;
        }
        uVar51 = local_a8[lVar43];
        uVar56 = (ulong)uVar51;
        local_f0 = (HistogramCommand *)
                   BrotliHistogramBitCostDistanceDistance(pHVar31,local_118 + uVar56,pHVar31 + 1);
        if (sVar37 != 0) {
          sVar55 = 0;
          do {
            dVar58 = BrotliHistogramBitCostDistanceDistance
                               (pHVar31,local_118 + puVar35[sVar55],pHVar31 + 1);
            if (dVar58 < (double)local_f0) {
              uVar56 = (ulong)puVar35[sVar55];
              local_f0 = (HistogramCommand *)dVar58;
            }
            uVar51 = (uint)uVar56;
            sVar55 = sVar55 + 1;
          } while (sVar37 != sVar55);
        }
        local_a8[uVar52] = uVar51;
        if (*(int *)((long)local_108 + (ulong)uVar51 * 4) == -1) {
          *(int *)((long)local_108 + (ulong)uVar51 * 4) = iVar121;
          iVar121 = iVar121 + 1;
        }
        uVar52 = uVar52 + 1;
      } while (uVar52 != uVar25);
    }
    BrotliFree(m,pHVar31);
    BrotliFree(m,puVar35);
    BrotliFree(m,local_118);
    uVar52 = dist_split->types_alloc_size;
    if (uVar52 < uVar25) {
      if (uVar52 == 0) {
        uVar52 = uVar25;
      }
      do {
        uVar56 = uVar52;
        uVar52 = uVar56 * 2;
      } while (uVar56 < uVar25);
      if (uVar56 == 0) {
        puVar18 = (uint8_t *)0x0;
      }
      else {
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar56);
      }
      if (dist_split->types_alloc_size != 0) {
        switchD_00b1422a::default(puVar18,dist_split->types,dist_split->types_alloc_size);
      }
      BrotliFree(m,dist_split->types);
      dist_split->types = puVar18;
      dist_split->types_alloc_size = uVar56;
    }
    uVar52 = dist_split->lengths_alloc_size;
    if (uVar52 < uVar25) {
      if (uVar52 == 0) {
        uVar52 = uVar25;
      }
      do {
        uVar56 = uVar52;
        uVar52 = uVar56 * 2;
      } while (uVar56 < uVar25);
      if (uVar56 == 0) {
        puVar36 = (uint32_t *)0x0;
      }
      else {
        puVar36 = (uint32_t *)BrotliAllocate(m,uVar56 * 4);
      }
      if (dist_split->lengths_alloc_size != 0) {
        switchD_00b1422a::default(puVar36,dist_split->lengths,dist_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,dist_split->lengths);
      dist_split->lengths = puVar36;
      dist_split->lengths_alloc_size = uVar56;
    }
    uVar42 = 0;
    if (uVar25 == 0) {
      sVar55 = 1;
      sVar37 = 0;
    }
    else {
      uVar51 = 0;
      sVar37 = 0;
      uVar52 = 0;
      do {
        uVar42 = uVar42 + puVar20[uVar52 + 0x100];
        if ((uVar25 - 1 == uVar52) || (local_a8[uVar52] != local_a8[uVar52 + 1])) {
          uVar49 = uVar51 & 0xff;
          uVar3 = *(uint *)((long)local_108 + (ulong)local_a8[uVar52] * 4);
          bVar50 = (byte)uVar3;
          dist_split->types[sVar37] = bVar50;
          bVar48 = (byte)uVar51;
          uVar51 = uVar3;
          if (bVar50 < bVar48) {
            uVar51 = uVar49;
          }
          dist_split->lengths[sVar37] = uVar42;
          sVar37 = sVar37 + 1;
          uVar42 = 0;
        }
        uVar52 = uVar52 + 1;
      } while (uVar25 != uVar52);
      sVar55 = (ulong)(uVar51 & 0xff) + 1;
    }
    dist_split->num_blocks = sVar37;
    dist_split->num_types = sVar55;
    BrotliFree(m,local_108);
    BrotliFree(m,puVar20);
    BrotliFree(m,local_a8);
    BrotliFree(m,pvVar57);
  }
  BrotliFree(m,pvVar21);
  return;
}

Assistant:

void duckdb_brotli::BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literals)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
     * Literal histograms can have alphabet size up to 256.
     * Though, to accomodate context modeling, less than half of maximum size
     * is allowed. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
    /* NB: this might be a good place for injecting extra splitting without
     *     increasing encoder complexity; however, output parition would be less
     *     optimal than one produced with forced splitting inside
     *     SplitByteVector (FindBlocks / ClusterBlocks). */
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(insert_and_copy_codes)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO(eustas): reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_prefixes)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kDistanceStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}